

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_msmblur.h
# Opt level: O1

NodeRecordMB4D * __thiscall
embree::sse2::BVHBuilderMSMBlur::
BuilderT<embree::NodeRefPtr<4>,_embree::sse2::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
::createLargeLeaf(NodeRecordMB4D *__return_storage_ptr__,
                 BuilderT<embree::NodeRefPtr<4>,_embree::sse2::GridRecalculatePrimRef,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::sse2::CreateMSMBlurLeafGrid<4>,_embree::Scene::BuildProgressMonitorInterface>
                 *this,BuildRecord *in,CachedAllocator alloc)

{
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  char *pcVar3;
  ushort uVar4;
  ushort uVar5;
  BBox1f BVar6;
  size_t end;
  BBox1f *pBVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar8;
  ThreadLocal2 *pTVar9;
  ThreadLocal2 *pTVar10;
  iterator iVar11;
  BBox1f *pBVar12;
  Geometry *pGVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar34;
  SubGridBuildData *pSVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  char cVar39;
  uint uVar40;
  size_t i;
  long lVar41;
  long lVar42;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *paVar43;
  BBox1f BVar44;
  void *pvVar45;
  float *pfVar46;
  long lVar47;
  size_t sVar48;
  undefined8 *puVar49;
  runtime_error *prVar50;
  int iVar51;
  ulong uVar52;
  ushort uVar53;
  ulong uVar54;
  char *pcVar55;
  char *pcVar56;
  undefined4 uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ushort uVar64;
  ulong uVar65;
  PrimRefMB *pPVar66;
  mvector<PrimRefMB> *prims;
  ulong uVar67;
  BuildRecord *in_00;
  undefined1 (*pauVar68) [16];
  bool bVar69;
  bool bVar70;
  uint uVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  uint uVar96;
  uint uVar98;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  uint uVar97;
  uint uVar99;
  uint uVar100;
  uint uVar101;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  uint uVar102;
  uint uVar124;
  float fVar125;
  float fVar128;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  uint uVar126;
  uint uVar129;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar123;
  float fVar130;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar148 [16];
  float fVar152;
  float fVar161;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar160;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar166;
  float fVar167;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar165;
  float fVar168;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar175;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar176;
  float fVar180;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar181;
  float fVar182;
  float fVar185;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar186;
  float fVar187;
  float fVar188;
  unique_ptr<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>,_std::default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>_>
  new_vector;
  BBox1f time_range1;
  BBox1f time_range0;
  vint4 ilower;
  PrimRefVector lprims;
  vint4 iupper;
  uint primID [4];
  BBox3fa bounds0 [4];
  BBox3fa bounds1 [4];
  uint y [4];
  anon_class_1_0_00000001 reduction2;
  uint geomIDs [4];
  uint x [4];
  NodeRecordMB4D values [16];
  AABBNode node0;
  task_group_context *in_stack_ffffffffffffe080;
  undefined1 local_1f60 [16];
  undefined1 local_1f50 [16];
  undefined1 local_1f30 [16];
  undefined1 local_1ef0 [16];
  undefined4 uStack_1ec4;
  float local_1ec0;
  float fStack_1ebc;
  float fStack_1eb8;
  float fStack_1eb4;
  BBox1f local_1ea8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ea0;
  NodeRecordMB4D *local_1e88;
  undefined1 local_1e80 [16];
  undefined1 local_1e70 [16];
  undefined1 local_1e60 [8];
  undefined8 uStack_1e58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e50;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1e40;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1e30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e10;
  size_t local_1e00;
  size_t sStack_1df8;
  size_t local_1df0;
  size_t sStack_1de8;
  float local_1de0;
  float fStack_1ddc;
  float fStack_1dd8;
  float fStack_1dd4;
  undefined1 local_1dd0 [16];
  undefined1 local_1dc0 [16];
  ulong local_1db0;
  BBox1f local_1da8;
  float local_1d9c;
  float local_1d98;
  int local_1d94;
  undefined1 local_1d90 [8];
  undefined8 uStack_1d88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d80;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d70;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d60;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d50;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d40;
  unsigned_long local_1d30;
  size_t sStack_1d28;
  size_t local_1d20;
  size_t sStack_1d18;
  float local_1d10;
  float fStack_1d0c;
  float fStack_1d08;
  float fStack_1d04;
  undefined1 local_1d00 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1cf0;
  undefined8 local_1ce0;
  ulong local_1cd8;
  ThreadLocal2 *local_1cd0;
  char *local_1cc8;
  ulong local_1cc0;
  long local_1cb8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1cb0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ca0;
  size_t local_1c90;
  undefined8 uStack_1c88;
  ulong local_1c80;
  ulong uStack_1c78;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1c70;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 local_1c50;
  undefined8 uStack_1c48;
  size_t local_1c40;
  size_t sStack_1c38;
  ThreadLocal2 *local_1c30;
  size_t sStack_1c28;
  BBox1f local_1c20;
  BBox1f BStack_1c18;
  BBox1f local_1c10;
  anon_class_1_0_00000001 *local_1c00;
  undefined8 uStack_1bf8;
  size_t local_1bf0;
  ulong local_1be0;
  ulong uStack_1bd8;
  ulong local_1bd0;
  ulong uStack_1bc8;
  undefined1 local_1bc0 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1bb0;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 local_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b70;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1b60;
  unsigned_long local_1b50;
  size_t sStack_1b48;
  ThreadLocal2 *local_1b40;
  size_t sStack_1b38;
  BBox1f local_1b30;
  BBox1f BStack_1b28;
  BBox1f local_1b20;
  undefined8 local_1b10;
  undefined8 uStack_1b08;
  size_t local_1b00;
  ulong local_1af0;
  ulong uStack_1ae8;
  ulong local_1ae0;
  ulong uStack_1ad8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ad0;
  undefined8 local_1ac0;
  BBox1f *local_1ab8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1ab0;
  size_t local_1aa8;
  ThreadLocal2 *local_1aa0;
  PrimRefMB *local_1a98;
  SubGridBuildData *local_1a90;
  ulong local_1a88;
  char *local_1a80;
  long local_1a78;
  ulong local_1a70;
  anon_class_24_3_35f68c7c local_1a68;
  undefined1 local_1a50 [16];
  undefined1 local_1a40 [12];
  task_group_context_version tStack_1a34;
  context_traits cStack_1a33;
  undefined2 uStack_1a32;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1a00;
  unsigned_long local_19f0;
  unsigned_long uStack_19e8;
  size_t local_19e0;
  size_t sStack_19d8;
  BBox1f local_19d0;
  BBox1f BStack_19c8;
  undefined4 local_19c0;
  undefined1 *local_19bc;
  undefined4 local_19b4;
  undefined1 local_19b0 [16];
  anon_union_8_2_d71db6ad_for_task_group_context_11 local_19a0;
  intrusive_list_node *local_1990;
  intrusive_list_node *piStack_1988;
  string_resource_index local_1970;
  ulong local_1930;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1920;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1910;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1900;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18f0;
  float local_18e0;
  float fStack_18dc;
  float fStack_18d8;
  float fStack_18d4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_18d0;
  ThreadLocal2 *local_18c0;
  ThreadLocal2 *pTStack_18b8;
  ThreadLocal2 *local_18b0;
  size_t sStack_18a8;
  undefined1 local_18a0 [8];
  BBox1f BStack_1898;
  BBox1f local_1890;
  MutexSys *local_1880;
  uint uStack_1874;
  size_t local_1870;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 local_1850;
  undefined8 uStack_1848;
  ThreadLocal2 *local_1840;
  size_t sStack_1838;
  BBox1f local_1830;
  BBox1f BStack_1828;
  float local_1820 [4];
  float local_1810 [4];
  float local_1800 [4];
  float local_17f0 [4];
  float local_17e0 [4];
  float local_17d0 [353];
  undefined8 uStack_124c;
  undefined1 local_1240 [8];
  undefined8 uStack_1238;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1230;
  undefined1 local_1220 [8];
  float fStack_1218;
  float fStack_1214;
  undefined1 local_1210 [8];
  float fStack_1208;
  float fStack_1204;
  undefined1 local_1200 [8];
  float fStack_11f8;
  float fStack_11f4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_11f0;
  undefined1 local_11e0 [8];
  float fStack_11d8;
  float fStack_11d4;
  float local_11d0 [2];
  undefined8 uStack_11c8;
  ThreadLocal2 *local_11c0;
  size_t sStack_11b8;
  BBox1f local_11b0;
  BBox1f BStack_11a8;
  float fStack_11a4;
  BBox1f local_11a0 [2];
  undefined1 local_1190 [8];
  undefined8 uStack_1188;
  size_t local_1180 [2];
  ulong local_1170 [454];
  BBox1f *local_340 [16];
  ulong local_2c0;
  BBox1f local_2b8;
  BBox1f local_2b0 [63];
  long local_b8;
  undefined8 uVar127;
  
  local_1dd0._8_8_ = local_1dd0._0_8_;
  local_1dc0._8_8_ = local_1dc0._0_8_;
  local_1e70._8_8_ = local_1e70._0_8_;
  uVar67 = in->depth;
  local_1e88 = __return_storage_ptr__;
  if ((this->cfg).maxDepth < uVar67) {
    puVar49 = (undefined8 *)__cxa_allocate_exception(0x30);
    local_1240 = (undefined1  [8])&local_1230;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1240,"depth limit reached","");
    *puVar49 = &PTR__rtcore_error_022018b0;
    *(undefined4 *)(puVar49 + 1) = 1;
    puVar49[2] = puVar49 + 4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar49 + 2),local_1240,
               (long)local_1240 + CONCAT71(uStack_1238._1_7_,(undefined1)uStack_1238));
    __cxa_throw(puVar49,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
  }
  aVar123 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
            bounds0.lower.field_0;
  aVar160 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
            bounds0.upper.field_0;
  aVar165 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
            bounds1.lower.field_0;
  aVar34 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.
           bounds1.upper.field_0.field_1;
  uStack_1ec4 = (undefined4)
                ((ulong)*(undefined8 *)
                         ((long)&(in->prims).super_PrimInfoMB.
                                 super_CentGeom<embree::LBBox<embree::Vec3fa>_>.geomBounds.bounds1.
                                 upper.field_0 + 8) >> 0x20);
  uVar127 = *(undefined8 *)
             &(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.centBounds
              .lower.field_0;
  uVar24 = *(undefined8 *)
            ((long)&(in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
                    centBounds.lower.field_0 + 8);
  local_1ea0 = (in->prims).super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               centBounds.upper.field_0;
  local_1830 = (in->prims).super_PrimInfoMB.max_time_range;
  BStack_1828 = (in->prims).super_PrimInfoMB.time_range;
  local_1840 = (ThreadLocal2 *)(in->prims).super_PrimInfoMB.num_time_segments;
  sStack_1838 = (in->prims).super_PrimInfoMB.max_num_time_segments;
  BVar6 = (BBox1f)(in->prims).prims;
  local_1d00._8_8_ = local_1d00._0_8_;
  local_1d00._0_8_ = in;
  pTVar9 = (ThreadLocal2 *)(in->prims).super_PrimInfoMB.object_range._begin;
  pTVar10 = (ThreadLocal2 *)(in->prims).super_PrimInfoMB.object_range._end;
  findFallback((Split *)local_1240,this,&in->prims);
  local_1180[0] = local_1230._0_8_;
  local_1190 = local_1240;
  local_1ec0 = (float)uVar127;
  fStack_1ebc = (float)((ulong)uVar127 >> 0x20);
  fStack_1eb8 = (float)uVar24;
  fStack_1eb4 = (float)((ulong)uVar24 >> 0x20);
  local_18f0.m128[3] = (float)uStack_1ec4;
  local_18f0.field_1 = aVar34;
  local_1930 = uVar67;
  local_1920 = aVar123;
  local_1910 = aVar160;
  local_1900 = aVar165;
  local_18e0 = local_1ec0;
  fStack_18dc = fStack_1ebc;
  fStack_18d8 = fStack_1eb8;
  fStack_18d4 = fStack_1eb4;
  local_18d0.m128 = local_1ea0.m128;
  local_18c0 = pTVar9;
  pTStack_18b8 = pTVar10;
  BStack_1898.lower = BStack_1828.lower;
  BStack_1898.upper = BStack_1828.upper;
  local_18a0._0_4_ = local_1830.lower;
  local_18a0._4_4_ = local_1830.upper;
  local_18b0 = local_1840;
  sStack_18a8 = sStack_1838;
  auVar81 = _local_18a0;
  local_1890 = BVar6;
  local_1880 = (MutexSys *)local_1240;
  local_1870 = local_1230._0_8_;
  local_1170[0] = (ulong)local_1220;
  local_1170[1] = _fStack_1218;
  local_1860 = local_1220;
  uStack_1858 = _fStack_1218;
  local_1170[2] = (ulong)local_1210;
  local_1170[3] = _fStack_1208;
  local_1850 = local_1210;
  uStack_1848 = _fStack_1208;
  if ((uVar67 == 1) && (pTVar10 != pTVar9)) {
    BStack_1898.lower = BStack_1828.lower;
    BStack_1898.upper = BStack_1828.upper;
    lVar41 = (long)pTVar10 - (long)pTVar9;
    if (pTVar10 < pTVar9 || lVar41 == 0) {
      fVar176 = INFINITY;
      fVar182 = -INFINITY;
    }
    else {
      pfVar46 = &(*(PrimRefMB **)((long)BVar6 + 0x20))[(long)pTVar9].time_range.upper;
      auVar138._0_12_ = ZEXT812(0x7f800000);
      auVar138._12_4_ = 0;
      fVar181 = -INFINITY;
      do {
        if (((BBox1f *)(pfVar46 + -1))->lower <= auVar138._0_4_) {
          auVar138._0_4_ = ((BBox1f *)(pfVar46 + -1))->lower;
        }
        fVar176 = auVar138._0_4_;
        fVar182 = *pfVar46;
        if (*pfVar46 <= fVar181) {
          fVar182 = fVar181;
        }
        pfVar46 = pfVar46 + 0x14;
        lVar41 = lVar41 + -1;
        fVar181 = fVar182;
      } while (lVar41 != 0);
    }
    uVar57 = -(uint)(BStack_1898.lower < fVar176 || fVar182 < BStack_1898.upper) & 0xffffff01;
  }
  else {
    uVar57 = 0.0;
  }
  local_1aa0 = pTVar10;
  local_1cd0 = pTVar9;
  local_1db0 = (long)pTVar10 - (long)pTVar9;
  _local_18a0 = auVar81;
  if (((local_1db0 <= (this->cfg).maxLeafSize) &&
      (uStack_1874 = SUB74(uStack_1238._1_7_,3), uStack_1874 < 2)) && ((char)uVar57 == '\0')) {
    pPVar66 = *(PrimRefMB **)((long)BVar6 + 0x20);
    local_1a40._0_4_ = pPVar66[(long)pTVar9].lbounds.bounds0.lower.field_0.m128[3];
    uVar40 = 1;
    if (1 < local_1db0) {
      uVar67 = 1;
      do {
        fVar182 = pPVar66[(long)&(pTVar9->mutex).mutex + uVar67].lbounds.bounds0.lower.field_0.m128
                  [3];
        uVar54 = (ulong)uVar40;
        if (uVar40 != 0) {
          uVar59 = 0;
          do {
            if (fVar182 == *(float *)(local_1a40 + uVar59 * 4)) goto LAB_00d7a5be;
            uVar59 = uVar59 + 1;
          } while (uVar54 != uVar59);
        }
        uVar40 = uVar40 + 1;
        *(float *)(local_1a40 + uVar54 * 4) = fVar182;
LAB_00d7a5be:
        uVar67 = uVar67 + 1;
      } while (uVar67 != local_1db0);
    }
    local_1cd8 = (ulong)uVar40;
    local_1bc0._0_8_ = (MutexSys *)((ulong)uVar40 * 0x90);
    pTVar10 = (alloc.talloc1)->parent;
    if (alloc.alloc != (pTVar10->alloc)._M_b._M_p) {
      sStack_1838 = CONCAT71(sStack_1838._1_7_,1);
      local_1840 = pTVar10;
      MutexSys::lock(&pTVar10->mutex);
      if ((pTVar10->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesUsed + (pTVar10->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar10->alloc0).end + (pTVar10->alloc1).end) -
             ((pTVar10->alloc0).cur + (pTVar10->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar10->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar10->alloc1).bytesWasted + (pTVar10->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar10->alloc0).bytesUsed = 0;
      (pTVar10->alloc0).bytesWasted = 0;
      (pTVar10->alloc0).end = 0;
      (pTVar10->alloc0).allocBlockSize = 0;
      (pTVar10->alloc0).ptr = (char *)0x0;
      (pTVar10->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
      }
      else {
        (pTVar10->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar10->alloc1).ptr = (char *)0x0;
        (pTVar10->alloc1).cur = 0;
        (pTVar10->alloc1).end = 0;
        (pTVar10->alloc1).allocBlockSize = 0;
        (pTVar10->alloc1).bytesUsed = 0;
        (pTVar10->alloc1).bytesWasted = 0;
        (pTVar10->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar10->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      local_1240 = (undefined1  [8])&FastAllocator::s_thread_local_allocators_lock;
      uStack_1238._0_1_ = '\x01';
      local_1cb0._0_8_ = pTVar10;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar11._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)&local_1cb0);
      }
      else {
        *iVar11._M_current = (ThreadLocal2 *)local_1cb0._0_8_;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if ((undefined1)uStack_1238 == '\x01') {
        MutexSys::unlock((MutexSys *)local_1240);
      }
      if ((char)sStack_1838 == '\x01') {
        MutexSys::unlock(&local_1840->mutex);
      }
    }
    (alloc.talloc1)->bytesUsed = (long)(void **)local_1bc0._0_8_ + (alloc.talloc1)->bytesUsed;
    sVar48 = (alloc.talloc1)->cur;
    uVar67 = (ulong)(-(int)sVar48 & 0xf);
    uVar54 = (long)(void **)local_1bc0._0_8_ + uVar67 + sVar48;
    (alloc.talloc1)->cur = uVar54;
    if ((alloc.talloc1)->end < uVar54) {
      (alloc.talloc1)->cur = sVar48;
      if ((MutexSys *)(alloc.talloc1)->allocBlockSize < (MutexSys *)(local_1bc0._0_8_ << 2)) {
        pcVar55 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1bc0);
      }
      else {
        local_1240 = (undefined1  [8])(alloc.talloc1)->allocBlockSize;
        pcVar55 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1240);
        (alloc.talloc1)->ptr = pcVar55;
        sVar48 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
        (alloc.talloc1)->bytesWasted = sVar48;
        (alloc.talloc1)->cur = 0;
        (alloc.talloc1)->end = (size_t)local_1240;
        (alloc.talloc1)->cur = local_1bc0._0_8_;
        if ((ulong)local_1240 < (ulong)local_1bc0._0_8_) {
          (alloc.talloc1)->cur = 0;
          local_1240 = (undefined1  [8])(alloc.talloc1)->allocBlockSize;
          pcVar55 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1240);
          (alloc.talloc1)->ptr = pcVar55;
          sVar48 = ((alloc.talloc1)->end - (alloc.talloc1)->cur) + (alloc.talloc1)->bytesWasted;
          (alloc.talloc1)->bytesWasted = sVar48;
          (alloc.talloc1)->cur = 0;
          (alloc.talloc1)->end = (size_t)local_1240;
          (alloc.talloc1)->cur = local_1bc0._0_8_;
          if ((ulong)local_1240 < (ulong)local_1bc0._0_8_) {
            (alloc.talloc1)->cur = 0;
            pcVar55 = (char *)0x0;
            goto LAB_00d7af95;
          }
        }
        (alloc.talloc1)->bytesWasted = sVar48;
      }
    }
    else {
      (alloc.talloc1)->bytesWasted = (alloc.talloc1)->bytesWasted + uVar67;
      pcVar55 = (alloc.talloc1)->ptr + (uVar54 - local_1bc0._0_8_);
    }
LAB_00d7af95:
    uVar67 = 7;
    if (local_1cd8 < 7) {
      uVar67 = local_1cd8;
    }
    local_1aa8 = uVar67 | (ulong)pcVar55 | 8;
    if (local_1cd8 == 0) {
      local_1e70._8_8_ = 0x7f8000007f800000;
      local_1e70._0_8_ = 0x7f8000007f800000;
      local_1d00._8_8_ = 0x7f8000007f800000;
      local_1d00._0_8_ = 0x7f8000007f800000;
      local_1dc0._8_8_ = 0xff800000ff800000;
      local_1dc0._0_8_ = 0xff800000ff800000;
      local_1dd0._8_8_ = 0xff800000ff800000;
      local_1dd0._0_8_ = 0xff800000ff800000;
    }
    else {
      pPVar66 = pPVar66 + (long)pTVar9;
      local_1cc8 = pcVar55;
      local_1cc0 = 0;
      local_1dd0._8_4_ = 0xff800000;
      local_1dd0._0_8_ = 0xff800000ff800000;
      local_1dd0._12_4_ = 0xff800000;
      local_1d00._8_4_ = 0x7f800000;
      local_1d00._0_8_ = 0x7f8000007f800000;
      local_1d00._12_4_ = 0x7f800000;
      local_1dc0._8_4_ = 0xff800000;
      local_1dc0._0_8_ = 0xff800000ff800000;
      local_1dc0._12_4_ = 0xff800000;
      local_1e70._8_4_ = 0x7f800000;
      local_1e70._0_8_ = 0x7f8000007f800000;
      local_1e70._12_4_ = 0x7f800000;
      local_1a98 = pPVar66;
      do {
        fVar128 = -INFINITY;
        fVar125 = -INFINITY;
        fVar187 = -INFINITY;
        fVar186 = -INFINITY;
        fVar188 = INFINITY;
        fVar181 = INFINITY;
        fVar176 = INFINITY;
        fVar182 = INFINITY;
        uVar40 = *(uint *)(local_1a40 + local_1cc0 * 4);
        uVar67 = (ulong)uVar40;
        if (local_1aa0 == local_1cd0) {
          uVar59 = 0;
        }
        else {
          pGVar13 = (((this->createLeaf).scene)->geometries).items[uVar67].ptr;
          local_1a90 = (this->createLeaf).sgrids;
          local_1d98 = BStack_1898.lower;
          local_1d9c = BStack_1898.upper;
          uVar54 = 0;
          uVar59 = 0;
          local_1a80 = pcVar55;
          local_1a88 = uVar67;
          do {
            pSVar35 = local_1a90;
            if (pPVar66[uVar54].lbounds.bounds0.lower.field_0.m128[3] == (float)uVar67) {
              fVar182 = pPVar66[uVar54].lbounds.bounds0.upper.field_0.m128[3];
              uVar4 = local_1a90[(uint)fVar182].sx;
              *(uint *)(local_19b0 + uVar59 * 4) = (uint)uVar4;
              uVar53 = local_1a90[(uint)fVar182].sy;
              (&local_1ad0.field_1.x)[uVar59] = (float)(uint)uVar53;
              uVar40 = pSVar35[(uint)fVar182].primID;
              local_1a70 = uVar59;
              *(uint *)((long)&local_1cf0 + uVar59 * 4) = uVar40;
              uVar65 = (ulong)uVar4 & 0x7fff;
              uVar61 = (ulong)uVar53 & 0x7fff;
              lVar41 = *(long *)&pGVar13->field_0x58;
              lVar42 = (ulong)uVar40 *
                       pGVar13[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
              fVar130 = pGVar13->fnumTimeSegments;
              fVar182 = (pGVar13->time_range).lower;
              fVar164 = (pGVar13->time_range).upper - fVar182;
              fVar133 = (local_1d98 - fVar182) / fVar164;
              fVar164 = (local_1d9c - fVar182) / fVar164;
              local_1ea0.m128[0] = fVar133;
              fVar133 = fVar130 * fVar133;
              fVar146 = fVar130 * fVar164;
              fVar135 = floorf(fVar133);
              fVar134 = ceilf(fVar146);
              uVar67 = local_1a70;
              fVar163 = (float)DAT_01ff0930;
              fVar186 = (float)DAT_01feba00;
              fVar187 = DAT_01feba00._4_4_;
              fVar125 = DAT_01feba00._8_4_;
              fVar128 = DAT_01feba00._12_4_;
              fVar182 = (float)DAT_01feb9f0;
              fVar176 = DAT_01feb9f0._4_4_;
              fVar181 = DAT_01feb9f0._8_4_;
              fVar188 = DAT_01feb9f0._12_4_;
              local_1d94 = (int)fVar135;
              if (fVar135 <= 0.0) {
                fVar135 = 0.0;
              }
              if (local_1d94 < 0) {
                local_1d94 = -1;
              }
              iVar51 = (int)fVar130 + 1;
              if ((int)fVar134 < (int)fVar130 + 1) {
                iVar51 = (int)fVar134;
              }
              uVar4 = *(ushort *)(lVar41 + 10 + lVar42);
              uVar52 = (ulong)uVar4;
              if (uVar61 + 3 < (ulong)uVar4) {
                uVar52 = uVar61 + 3;
              }
              local_1a78 = (long)(int)fVar135;
              uVar53 = (ushort)uVar61;
              fVar185 = DAT_01ff0930._4_4_;
              fVar76 = DAT_01ff0930._8_4_;
              fVar77 = DAT_01ff0930._12_4_;
              uVar64 = (ushort)uVar65;
              auVar81 = _DAT_01feb9f0;
              auVar138 = _DAT_01feba00;
              if (uVar53 < uVar4) {
                uVar5 = *(ushort *)(lVar41 + 8 + lVar42);
                uVar58 = (ulong)uVar5;
                if (uVar65 + 3 < (ulong)uVar5) {
                  uVar58 = uVar65 + 3;
                }
                bVar69 = true;
                uVar62 = uVar61;
                auVar169 = _DAT_01feba00;
                auVar172 = _DAT_01feb9f0;
                do {
                  if (uVar64 < uVar5) {
                    uVar63 = *(ulong *)&pGVar13[2].numPrimitives;
                    lVar14 = *(long *)(uVar63 + 0x10 + local_1a78 * 0x38);
                    pauVar68 = (undefined1 (*) [16])
                               ((*(uint *)(lVar41 + lVar42) + uVar65 +
                                *(uint *)(lVar41 + 4 + lVar42) * uVar62) * lVar14 +
                               *(long *)(uVar63 + local_1a78 * 0x38));
                    lVar47 = uVar58 - uVar65;
                    do {
                      auVar81 = *pauVar68;
                      auVar159._0_4_ =
                           -(uint)(auVar81._0_4_ < fVar163 && -1.844e+18 < auVar81._0_4_);
                      auVar159._4_4_ =
                           -(uint)(auVar81._4_4_ < fVar185 && -1.844e+18 < auVar81._4_4_);
                      auVar159._8_4_ = -(uint)(auVar81._8_4_ < fVar76 && -1.844e+18 < auVar81._8_4_)
                      ;
                      auVar159._12_4_ =
                           -(uint)(auVar81._12_4_ < fVar77 && -1.844e+18 < auVar81._12_4_);
                      uVar57 = movmskps((int)uVar63,auVar159);
                      uVar63 = (ulong)CONCAT31((int3)((uint)uVar57 >> 8),~(byte)uVar57);
                      if ((~(byte)uVar57 & 7) != 0) {
                        auVar81 = _DAT_01feb9f0;
                        auVar138 = _DAT_01feba00;
                        if (!bVar69) {
                          auVar81 = auVar172;
                          auVar138 = auVar169;
                        }
                        goto LAB_00d7c695;
                      }
                      auVar172 = minps(auVar172,auVar81);
                      auVar169 = maxps(auVar169,auVar81);
                      pauVar68 = (undefined1 (*) [16])(*pauVar68 + lVar14);
                      lVar47 = lVar47 + -1;
                    } while (lVar47 != 0);
                  }
                  uVar62 = uVar62 + 1;
                  bVar69 = uVar62 < uVar52;
                  auVar81 = auVar172;
                  auVar138 = auVar169;
                } while (uVar62 != uVar52);
              }
LAB_00d7c695:
              if (fVar130 <= fVar134) {
                fVar134 = fVar130;
              }
              local_1cb8 = (long)(int)fVar134;
              auVar169 = _DAT_01feb9f0;
              auVar172 = _DAT_01feba00;
              if (uVar53 < uVar4) {
                uVar5 = *(ushort *)(lVar41 + 8 + lVar42);
                uVar58 = (ulong)uVar5;
                if (uVar65 + 3 < (ulong)uVar5) {
                  uVar58 = uVar65 + 3;
                }
                bVar69 = true;
                uVar62 = uVar61;
                auVar184 = _DAT_01feba00;
                auVar178 = _DAT_01feb9f0;
                do {
                  if (uVar64 < uVar5) {
                    uVar63 = *(ulong *)&pGVar13[2].numPrimitives;
                    lVar14 = *(long *)(uVar63 + 0x10 + local_1cb8 * 0x38);
                    pauVar68 = (undefined1 (*) [16])
                               ((*(uint *)(lVar41 + lVar42) + uVar65 +
                                *(uint *)(lVar41 + 4 + lVar42) * uVar62) * lVar14 +
                               *(long *)(uVar63 + local_1cb8 * 0x38));
                    lVar47 = uVar58 - uVar65;
                    do {
                      auVar169 = *pauVar68;
                      auVar170._0_4_ =
                           -(uint)(auVar169._0_4_ < fVar163 && -1.844e+18 < auVar169._0_4_);
                      auVar170._4_4_ =
                           -(uint)(auVar169._4_4_ < fVar185 && -1.844e+18 < auVar169._4_4_);
                      auVar170._8_4_ =
                           -(uint)(auVar169._8_4_ < fVar76 && -1.844e+18 < auVar169._8_4_);
                      auVar170._12_4_ =
                           -(uint)(auVar169._12_4_ < fVar77 && -1.844e+18 < auVar169._12_4_);
                      uVar57 = movmskps((int)uVar63,auVar170);
                      uVar63 = (ulong)CONCAT31((int3)((uint)uVar57 >> 8),~(byte)uVar57);
                      if ((~(byte)uVar57 & 7) != 0) {
                        auVar169 = _DAT_01feb9f0;
                        auVar172 = _DAT_01feba00;
                        if (!bVar69) {
                          auVar169 = auVar178;
                          auVar172 = auVar184;
                        }
                        goto LAB_00d7c78d;
                      }
                      auVar178 = minps(auVar178,auVar169);
                      auVar184 = maxps(auVar184,auVar169);
                      pauVar68 = (undefined1 (*) [16])(*pauVar68 + lVar14);
                      lVar47 = lVar47 + -1;
                    } while (lVar47 != 0);
                  }
                  uVar62 = uVar62 + 1;
                  bVar69 = uVar62 < uVar52;
                  auVar169 = auVar178;
                  auVar172 = auVar184;
                } while (uVar62 != uVar52);
              }
LAB_00d7c78d:
              fVar133 = fVar133 - fVar135;
              fVar136 = auVar169._0_4_;
              fVar135 = auVar81._0_4_;
              fVar147 = auVar172._0_4_;
              fVar149 = auVar172._4_4_;
              fVar150 = auVar172._8_4_;
              fVar151 = auVar172._12_4_;
              fVar168 = auVar138._0_4_;
              fVar175 = auVar138._4_4_;
              fVar180 = auVar138._8_4_;
              fVar145 = auVar138._12_4_;
              fVar78 = auVar81._4_4_;
              fVar79 = auVar81._8_4_;
              fVar161 = auVar81._12_4_;
              fVar162 = auVar169._4_4_;
              fVar166 = auVar169._8_4_;
              fVar167 = auVar169._12_4_;
              if (iVar51 - local_1d94 == 1) {
                if (fVar133 <= 0.0) {
                  fVar133 = 0.0;
                }
                fVar164 = 1.0 - fVar133;
                aVar123.m128[1] = fVar164 * fVar78 + fVar133 * fVar162;
                aVar123.m128[0] = fVar164 * fVar135 + fVar133 * fVar136;
                aVar160._0_4_ = fVar164 * fVar168 + fVar133 * fVar147;
                aVar160._4_4_ = fVar164 * fVar175 + fVar133 * fVar149;
                aVar160._8_4_ = fVar164 * fVar180 + fVar133 * fVar150;
                aVar160._12_4_ = fVar164 * fVar145 + fVar133 * fVar151;
                fVar130 = fVar134 - fVar146;
                if (fVar134 - fVar146 <= 0.0) {
                  fVar130 = 0.0;
                }
                fVar134 = 1.0 - fVar130;
                auVar132._0_4_ = fVar136 * fVar134 + fVar135 * fVar130;
                auVar132._4_4_ = fVar162 * fVar134 + fVar78 * fVar130;
                auVar132._8_4_ = fVar166 * fVar134 + fVar79 * fVar130;
                auVar132._12_4_ = fVar167 * fVar134 + fVar161 * fVar130;
                aVar165._0_4_ = fVar134 * fVar147 + fVar130 * fVar168;
                aVar165._4_4_ = fVar134 * fVar149 + fVar130 * fVar175;
                aVar165._8_4_ = fVar134 * fVar150 + fVar130 * fVar180;
                aVar165._12_4_ = fVar134 * fVar151 + fVar130 * fVar145;
                aVar123.m128[2] = fVar164 * fVar79 + fVar133 * fVar166;
                aVar123.m128[3] = fVar164 * fVar161 + fVar133 * fVar167;
              }
              else {
                auVar81 = _DAT_01feb9f0;
                auVar138 = _DAT_01feba00;
                if (uVar53 < uVar4) {
                  uVar5 = *(ushort *)(lVar41 + 8 + lVar42);
                  uVar58 = (ulong)uVar5;
                  if (uVar65 + 3 < (ulong)uVar5) {
                    uVar58 = uVar65 + 3;
                  }
                  bVar69 = true;
                  uVar62 = uVar61;
                  auVar169 = _DAT_01feba00;
                  auVar172 = _DAT_01feb9f0;
                  do {
                    if (uVar64 < uVar5) {
                      uVar63 = *(ulong *)&pGVar13[2].numPrimitives;
                      lVar14 = *(long *)(uVar63 + 0x48 + local_1a78 * 0x38);
                      pauVar68 = (undefined1 (*) [16])
                                 ((*(uint *)(lVar41 + lVar42) + uVar65 +
                                  *(uint *)(lVar41 + 4 + lVar42) * uVar62) * lVar14 +
                                 *(long *)(uVar63 + 0x38 + local_1a78 * 0x38));
                      lVar47 = uVar58 - uVar65;
                      do {
                        auVar81 = *pauVar68;
                        auVar179._0_4_ =
                             -(uint)(auVar81._0_4_ < fVar163 && -1.844e+18 < auVar81._0_4_);
                        auVar179._4_4_ =
                             -(uint)(auVar81._4_4_ < fVar185 && -1.844e+18 < auVar81._4_4_);
                        auVar179._8_4_ =
                             -(uint)(auVar81._8_4_ < fVar76 && -1.844e+18 < auVar81._8_4_);
                        auVar179._12_4_ =
                             -(uint)(auVar81._12_4_ < fVar77 && -1.844e+18 < auVar81._12_4_);
                        uVar57 = movmskps((int)uVar63,auVar179);
                        uVar63 = (ulong)CONCAT31((int3)((uint)uVar57 >> 8),~(byte)uVar57);
                        if ((~(byte)uVar57 & 7) != 0) {
                          auVar81 = _DAT_01feb9f0;
                          auVar138 = _DAT_01feba00;
                          if (!bVar69) {
                            auVar81 = auVar172;
                            auVar138 = auVar169;
                          }
                          goto LAB_00d7c8de;
                        }
                        auVar172 = minps(auVar172,auVar81);
                        auVar169 = maxps(auVar169,auVar81);
                        pauVar68 = (undefined1 (*) [16])(*pauVar68 + lVar14);
                        lVar47 = lVar47 + -1;
                      } while (lVar47 != 0);
                    }
                    uVar62 = uVar62 + 1;
                    bVar69 = uVar62 < uVar52;
                    auVar81 = auVar172;
                    auVar138 = auVar169;
                  } while (uVar62 != uVar52);
                }
LAB_00d7c8de:
                auVar169 = _DAT_01feb9f0;
                auVar172 = _DAT_01feba00;
                if (uVar53 < uVar4) {
                  uVar5 = *(ushort *)(lVar41 + 8 + lVar42);
                  uVar58 = (ulong)uVar5;
                  if (uVar65 + 3 < (ulong)uVar5) {
                    uVar58 = uVar65 + 3;
                  }
                  bVar69 = true;
                  uVar62 = uVar61;
                  auVar184 = _DAT_01feba00;
                  auVar178 = _DAT_01feb9f0;
                  do {
                    if (uVar64 < uVar5) {
                      uVar63 = *(ulong *)&pGVar13[2].numPrimitives;
                      lVar14 = *(long *)((uVar63 - 0x28) + local_1cb8 * 0x38);
                      pauVar68 = (undefined1 (*) [16])
                                 ((*(uint *)(lVar41 + lVar42) + uVar65 +
                                  *(uint *)(lVar41 + 4 + lVar42) * uVar62) * lVar14 +
                                 *(long *)((uVar63 - 0x38) + local_1cb8 * 0x38));
                      lVar47 = uVar58 - uVar65;
                      do {
                        auVar169 = *pauVar68;
                        auVar17._4_4_ =
                             -(uint)(auVar169._4_4_ < 1.844e+18 && -1.844e+18 < auVar169._4_4_);
                        auVar17._0_4_ =
                             -(uint)(auVar169._0_4_ < 1.844e+18 && -1.844e+18 < auVar169._0_4_);
                        auVar17._8_4_ =
                             -(uint)(auVar169._8_4_ < 1.844e+18 && -1.844e+18 < auVar169._8_4_);
                        auVar17._12_4_ =
                             -(uint)(auVar169._12_4_ < 1.844e+18 && -1.844e+18 < auVar169._12_4_);
                        uVar57 = movmskps((int)uVar63,auVar17);
                        uVar63 = (ulong)CONCAT31((int3)((uint)uVar57 >> 8),~(byte)uVar57);
                        if ((~(byte)uVar57 & 7) != 0) {
                          auVar169 = _DAT_01feb9f0;
                          auVar172 = _DAT_01feba00;
                          if (!bVar69) {
                            auVar169 = auVar178;
                            auVar172 = auVar184;
                          }
                          goto LAB_00d7c9b3;
                        }
                        auVar178 = minps(auVar178,auVar169);
                        auVar184 = maxps(auVar184,auVar169);
                        pauVar68 = (undefined1 (*) [16])(*pauVar68 + lVar14);
                        lVar47 = lVar47 + -1;
                      } while (lVar47 != 0);
                    }
                    uVar62 = uVar62 + 1;
                    bVar69 = uVar62 < uVar52;
                    auVar169 = auVar178;
                    auVar172 = auVar184;
                  } while (uVar62 != uVar52);
                }
LAB_00d7c9b3:
                if (fVar133 <= 0.0) {
                  fVar133 = 0.0;
                }
                fVar152 = 1.0 - fVar133;
                aVar123.m128[0] = fVar135 * fVar152 + auVar81._0_4_ * fVar133;
                aVar123.m128[1] = fVar78 * fVar152 + auVar81._4_4_ * fVar133;
                aVar123.m128[2] = fVar79 * fVar152 + auVar81._8_4_ * fVar133;
                aVar123.m128[3] = fVar161 * fVar152 + auVar81._12_4_ * fVar133;
                aVar160._0_4_ = fVar152 * fVar168 + fVar133 * auVar138._0_4_;
                aVar160._4_4_ = fVar152 * fVar175 + fVar133 * auVar138._4_4_;
                aVar160._8_4_ = fVar152 * fVar180 + fVar133 * auVar138._8_4_;
                aVar160._12_4_ = fVar152 * fVar145 + fVar133 * auVar138._12_4_;
                fVar133 = fVar134 - fVar146;
                if (fVar134 - fVar146 <= 0.0) {
                  fVar133 = 0.0;
                }
                fVar134 = 1.0 - fVar133;
                auVar132._0_4_ = fVar136 * fVar134 + auVar169._0_4_ * fVar133;
                auVar132._4_4_ = fVar162 * fVar134 + auVar169._4_4_ * fVar133;
                auVar132._8_4_ = fVar166 * fVar134 + auVar169._8_4_ * fVar133;
                auVar132._12_4_ = fVar167 * fVar134 + auVar169._12_4_ * fVar133;
                aVar165._0_4_ = fVar134 * fVar147 + fVar133 * auVar172._0_4_;
                aVar165._4_4_ = fVar134 * fVar149 + fVar133 * auVar172._4_4_;
                aVar165._8_4_ = fVar134 * fVar150 + fVar133 * auVar172._8_4_;
                aVar165._12_4_ = fVar134 * fVar151 + fVar133 * auVar172._12_4_;
                if ((int)(local_1d94 + 1U) < iVar51) {
                  uVar58 = (ulong)(local_1d94 + 1U);
                  do {
                    auVar81 = _DAT_01feb9f0;
                    auVar138 = _DAT_01feba00;
                    if (uVar53 < uVar4) {
                      uVar5 = *(ushort *)(lVar41 + 8 + lVar42);
                      uVar62 = (ulong)uVar5;
                      if (uVar65 + 3 < (ulong)uVar5) {
                        uVar62 = uVar65 + 3;
                      }
                      bVar69 = true;
                      uVar63 = uVar61;
                      auVar169 = _DAT_01feba00;
                      auVar172 = _DAT_01feb9f0;
                      do {
                        if (uVar64 < uVar5) {
                          uVar60 = *(ulong *)&pGVar13[2].numPrimitives;
                          lVar14 = *(long *)(uVar60 + 0x10 + uVar58 * 0x38);
                          pauVar68 = (undefined1 (*) [16])
                                     ((*(uint *)(lVar41 + lVar42) + uVar65 +
                                      *(uint *)(lVar41 + 4 + lVar42) * uVar63) * lVar14 +
                                     *(long *)(uVar60 + uVar58 * 0x38));
                          lVar47 = uVar62 - uVar65;
                          do {
                            auVar81 = *pauVar68;
                            auVar174._0_4_ =
                                 -(uint)(auVar81._0_4_ < fVar163 && -1.844e+18 < auVar81._0_4_);
                            auVar174._4_4_ =
                                 -(uint)(auVar81._4_4_ < fVar185 && -1.844e+18 < auVar81._4_4_);
                            auVar174._8_4_ =
                                 -(uint)(auVar81._8_4_ < fVar76 && -1.844e+18 < auVar81._8_4_);
                            auVar174._12_4_ =
                                 -(uint)(auVar81._12_4_ < fVar77 && -1.844e+18 < auVar81._12_4_);
                            uVar57 = movmskps((int)uVar60,auVar174);
                            uVar60 = (ulong)CONCAT31((int3)((uint)uVar57 >> 8),~(byte)uVar57);
                            if ((~(byte)uVar57 & 7) != 0) {
                              auVar81 = _DAT_01feb9f0;
                              auVar138 = _DAT_01feba00;
                              if (!bVar69) {
                                auVar81 = auVar172;
                                auVar138 = auVar169;
                              }
                              goto LAB_00d7cb2d;
                            }
                            auVar172 = minps(auVar172,auVar81);
                            auVar169 = maxps(auVar169,auVar81);
                            pauVar68 = (undefined1 (*) [16])(*pauVar68 + lVar14);
                            lVar47 = lVar47 + -1;
                          } while (lVar47 != 0);
                        }
                        uVar63 = uVar63 + 1;
                        bVar69 = uVar63 < uVar52;
                        auVar81 = auVar172;
                        auVar138 = auVar169;
                      } while (uVar63 != uVar52);
                    }
LAB_00d7cb2d:
                    fVar133 = ((float)(int)uVar58 / fVar130 - (float)local_1ea0._0_4_) /
                              (fVar164 - (float)local_1ea0._0_4_);
                    fVar79 = 1.0 - fVar133;
                    fVar146 = auVar132._4_4_;
                    fVar78 = auVar132._12_4_;
                    fVar175 = auVar132._8_4_;
                    fVar134 = aVar123.m128[1];
                    fVar135 = aVar123.m128[3];
                    fVar180 = aVar123.m128[2];
                    auVar148._0_4_ =
                         auVar81._0_4_ - (aVar123.m128[0] * fVar79 + auVar132._0_4_ * fVar133);
                    auVar148._4_4_ = auVar81._4_4_ - (fVar134 * fVar79 + fVar146 * fVar133);
                    auVar148._8_4_ = auVar81._8_4_ - (fVar180 * fVar79 + fVar175 * fVar133);
                    auVar148._12_4_ = auVar81._12_4_ - (fVar135 * fVar79 + fVar78 * fVar133);
                    fVar166 = aVar165.m128[1];
                    fVar167 = aVar165.m128[2];
                    fVar168 = aVar165.m128[3];
                    fVar161 = aVar160.m128[1];
                    fVar136 = aVar160.m128[2];
                    fVar162 = aVar160.m128[3];
                    auVar171._0_4_ =
                         auVar138._0_4_ - (fVar79 * aVar160.m128[0] + fVar133 * aVar165.m128[0]);
                    auVar171._4_4_ = auVar138._4_4_ - (fVar79 * fVar161 + fVar133 * fVar166);
                    auVar171._8_4_ = auVar138._8_4_ - (fVar79 * fVar136 + fVar133 * fVar167);
                    auVar171._12_4_ = auVar138._12_4_ - (fVar79 * fVar162 + fVar133 * fVar168);
                    auVar81 = minps(auVar148,ZEXT816(0));
                    auVar138 = maxps(auVar171,ZEXT816(0));
                    aVar123.m128[0] = aVar123.m128[0] + auVar81._0_4_;
                    aVar123.m128[1] = fVar134 + auVar81._4_4_;
                    aVar123.m128[2] = fVar180 + auVar81._8_4_;
                    aVar123.m128[3] = fVar135 + auVar81._12_4_;
                    auVar132._0_4_ = auVar132._0_4_ + auVar81._0_4_;
                    auVar132._4_4_ = fVar146 + auVar81._4_4_;
                    auVar132._8_4_ = fVar175 + auVar81._8_4_;
                    auVar132._12_4_ = fVar78 + auVar81._12_4_;
                    aVar160._0_4_ = aVar160.m128[0] + auVar138._0_4_;
                    aVar160._4_4_ = fVar161 + auVar138._4_4_;
                    aVar160._8_4_ = fVar136 + auVar138._8_4_;
                    aVar160._12_4_ = fVar162 + auVar138._12_4_;
                    aVar165._0_4_ = aVar165.m128[0] + auVar138._0_4_;
                    aVar165._4_4_ = fVar166 + auVar138._4_4_;
                    aVar165._8_4_ = fVar167 + auVar138._8_4_;
                    aVar165._12_4_ = fVar168 + auVar138._12_4_;
                    uVar58 = uVar58 + 1;
                  } while (iVar51 != (int)uVar58);
                }
              }
              local_1e70 = minps(local_1e70,(undefined1  [16])aVar123);
              local_1dc0 = maxps(local_1dc0,(undefined1  [16])aVar160);
              local_1d00 = minps(local_1d00,auVar132);
              local_1dd0 = maxps(local_1dd0,(undefined1  [16])aVar165);
              (&local_1cb0)[local_1a70 * 2] = aVar123;
              (&local_1ca0)[uVar67 * 2] = aVar160;
              *(undefined1 (*) [16])(local_1bc0 + uVar67 * 0x20) = auVar132;
              (&local_1bb0)[uVar67 * 2] = aVar165;
              uVar59 = (ulong)((int)uVar59 + 1);
              uVar67 = local_1a88;
              pPVar66 = local_1a98;
              pcVar55 = local_1a80;
            }
            uVar40 = (uint)uVar67;
            uVar54 = uVar54 + 1;
          } while (uVar54 != local_1db0);
        }
        lVar41 = local_1cc0 * 0x90;
        pcVar56 = local_1cc8 + local_1cc0 * 0x90;
        lVar42 = 0;
        do {
          pcVar3 = pcVar55 + lVar42 * 8;
          pcVar3[0] = '\0';
          pcVar3[1] = '\0';
          pcVar3[2] = '\0';
          pcVar3[3] = '\0';
          pcVar3[4] = -1;
          pcVar3[5] = -1;
          pcVar3[6] = -1;
          pcVar3[7] = -1;
          pcVar3[8] = '\0';
          pcVar3[9] = '\0';
          pcVar3[10] = '\0';
          pcVar3[0xb] = '\0';
          pcVar3[0xc] = -1;
          pcVar3[0xd] = -1;
          pcVar3[0xe] = -1;
          pcVar3[0xf] = -1;
          lVar42 = lVar42 + 2;
        } while (lVar42 != 4);
        pcVar3 = local_1cc8 + 0x20 + lVar41;
        pcVar3[0] = -1;
        pcVar3[1] = -1;
        pcVar3[2] = -1;
        pcVar3[3] = -1;
        pcVar56[0x30] = -1;
        pcVar56[0x31] = -1;
        pcVar56[0x32] = -1;
        pcVar56[0x33] = -1;
        pcVar56[0x28] = -1;
        pcVar56[0x29] = -1;
        pcVar56[0x2a] = -1;
        pcVar56[0x2b] = -1;
        pcVar3 = local_1cc8 + 0x24 + lVar41;
        pcVar3[0] = '\0';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar56[0x34] = '\0';
        pcVar56[0x35] = '\0';
        pcVar56[0x36] = '\0';
        pcVar56[0x37] = '\0';
        pcVar56[0x2c] = '\0';
        pcVar56[0x2d] = '\0';
        pcVar56[0x2e] = '\0';
        pcVar56[0x2f] = '\0';
        pcVar3 = local_1cc8 + 0x50 + lVar41;
        pcVar3[0] = -1;
        pcVar3[1] = -1;
        pcVar3[2] = -1;
        pcVar3[3] = -1;
        pcVar56[0x60] = -1;
        pcVar56[0x61] = -1;
        pcVar56[0x62] = -1;
        pcVar56[99] = -1;
        pcVar56[0x58] = -1;
        pcVar56[0x59] = -1;
        pcVar56[0x5a] = -1;
        pcVar56[0x5b] = -1;
        pcVar3 = local_1cc8 + 0x54 + lVar41;
        pcVar3[0] = '\0';
        pcVar3[1] = '\0';
        pcVar3[2] = '\0';
        pcVar3[3] = '\0';
        pcVar56[100] = '\0';
        pcVar56[0x65] = '\0';
        pcVar56[0x66] = '\0';
        pcVar56[0x67] = '\0';
        pcVar56[0x5c] = '\0';
        pcVar56[0x5d] = '\0';
        pcVar56[0x5e] = '\0';
        pcVar56[0x5f] = '\0';
        *(uint *)(pcVar56 + 0x88) = uVar40;
        *(float *)(pcVar56 + 0x80) = BStack_1898.lower;
        *(float *)(pcVar56 + 0x84) = 1.0 / (BStack_1898.upper - BStack_1898.lower);
        local_11e0._4_4_ = fVar176;
        local_11e0._0_4_ = fVar182;
        fStack_11d8 = fVar181;
        fStack_11d4 = fVar188;
        local_1200._4_4_ = fVar176;
        local_1200._0_4_ = fVar182;
        fStack_11f8 = fVar181;
        fStack_11f4 = fVar188;
        local_1220._4_4_ = fVar176;
        local_1220._0_4_ = fVar182;
        fStack_1218 = fVar181;
        fStack_1214 = fVar188;
        local_11d0[0] = fVar186;
        local_11d0[1] = fVar187;
        uStack_11c8._0_4_ = fVar125;
        uStack_11c8._4_4_ = fVar128;
        local_11f0.m128[0] = fVar186;
        local_11f0.m128[1] = fVar187;
        local_11f0.m128[2] = fVar125;
        local_11f0.m128[3] = fVar128;
        local_1210._4_4_ = fVar187;
        local_1210._0_4_ = fVar186;
        fStack_1208 = fVar125;
        fStack_1204 = fVar128;
        lVar41 = 0;
        do {
          *(undefined8 *)(local_1240 + lVar41 * 8) = 8;
          (&uStack_1238)[lVar41] = 8;
          lVar41 = lVar41 + 2;
        } while (lVar41 != 4);
        local_17e0[0] = fVar182;
        local_17e0[1] = fVar176;
        local_17e0[2] = fVar181;
        local_17e0[3] = fVar188;
        local_1800[0] = fVar182;
        local_1800[1] = fVar176;
        local_1800[2] = fVar181;
        local_1800[3] = fVar188;
        local_1820[0] = fVar182;
        local_1820[1] = fVar176;
        local_1820[2] = fVar181;
        local_1820[3] = fVar188;
        local_17d0[0] = fVar186;
        local_17d0[1] = fVar187;
        local_17d0[2] = fVar125;
        local_17d0[3] = fVar128;
        local_17f0[0] = fVar186;
        local_17f0[1] = fVar187;
        local_17f0[2] = fVar125;
        local_17f0[3] = fVar128;
        local_1810[0] = fVar186;
        local_1810[1] = fVar187;
        local_1810[2] = fVar125;
        local_1810[3] = fVar128;
        lVar41 = 0;
        do {
          (&local_1840)[lVar41] = (ThreadLocal2 *)0x8;
          (&sStack_1838)[lVar41] = 8;
          lVar41 = lVar41 + 2;
        } while (lVar41 != 4);
        if ((int)uVar59 != 0) {
          lVar41 = 0;
          do {
            *(ulong *)(pcVar55 + lVar41 * 2) =
                 CONCAT44(*(undefined4 *)((long)&local_1cf0 + lVar41),
                          *(int *)((long)&local_1ad0.field_1.x + lVar41) << 0x10 |
                          (uint)*(ushort *)(local_19b0 + lVar41));
            uVar57 = *(undefined4 *)((long)&local_1cb0 + lVar41 * 8 + 4);
            *(undefined4 *)(local_1220 + lVar41) = *(undefined4 *)((long)&local_1cb0 + lVar41 * 8);
            *(undefined4 *)(local_1200 + lVar41) = uVar57;
            *(undefined4 *)(local_11e0 + lVar41) =
                 *(undefined4 *)((long)&local_1cb0 + lVar41 * 8 + 8);
            *(undefined4 *)(local_1210 + lVar41) = *(undefined4 *)((long)&local_1ca0 + lVar41 * 8);
            *(undefined4 *)((long)&local_11f0 + lVar41) =
                 *(undefined4 *)((long)&local_1ca0 + lVar41 * 8 + 4);
            *(undefined4 *)((long)local_11d0 + lVar41) =
                 *(undefined4 *)((long)&local_1ca0 + lVar41 * 8 + 8);
            uVar57 = *(undefined4 *)(local_1bc0 + lVar41 * 8 + 4);
            *(undefined4 *)((long)local_1820 + lVar41) = *(undefined4 *)(local_1bc0 + lVar41 * 8);
            *(undefined4 *)((long)local_1800 + lVar41) = uVar57;
            *(undefined4 *)((long)local_17e0 + lVar41) =
                 *(undefined4 *)(local_1bc0 + lVar41 * 8 + 8);
            *(float *)((long)local_1810 + lVar41) = (&local_1bb0.field_1.x)[lVar41 * 2];
            uVar57 = *(undefined4 *)((long)&local_1bb0 + lVar41 * 8 + 8);
            *(undefined4 *)((long)local_17f0 + lVar41) =
                 *(undefined4 *)((long)&local_1bb0 + lVar41 * 8 + 4);
            *(undefined4 *)((long)local_17d0 + lVar41) = uVar57;
            lVar41 = lVar41 + 4;
          } while (uVar59 << 2 != lVar41);
        }
        fVar130 = local_1220._0_4_;
        fVar133 = local_1220._4_4_;
        fVar134 = local_1220._8_4_;
        fVar135 = local_1220._12_4_;
        fVar186 = local_1210._0_4_;
        fVar187 = local_1210._4_4_;
        fVar125 = local_1210._8_4_;
        fVar128 = local_1210._12_4_;
        uVar40 = -(uint)(fVar130 != fVar182);
        uVar72 = -(uint)(fVar133 != fVar176);
        uVar73 = -(uint)(fVar134 != fVar181);
        uVar74 = -(uint)(fVar135 != fVar188);
        auVar80._4_4_ = fVar130;
        auVar80._0_4_ = fVar133;
        auVar80._8_4_ = fVar135;
        auVar80._12_4_ = fVar134;
        auVar81 = minps(auVar80,(undefined1  [16])_local_1220);
        auVar137._0_8_ = auVar81._8_8_;
        auVar137._8_4_ = auVar81._0_4_;
        auVar137._12_4_ = auVar81._4_4_;
        auVar138 = minps(auVar137,auVar81);
        auVar82._4_4_ = fVar186;
        auVar82._0_4_ = fVar187;
        auVar82._8_4_ = fVar128;
        auVar82._12_4_ = fVar125;
        auVar81 = maxps(auVar82,(undefined1  [16])_local_1210);
        auVar18._4_8_ = local_1210._8_8_;
        auVar18._0_4_ = auVar81._4_4_;
        auVar103._0_8_ = auVar18._0_8_ << 0x20;
        auVar103._8_4_ = auVar81._8_4_;
        auVar103._12_4_ = auVar81._12_4_;
        uVar127 = auVar103._8_8_;
        auVar104._8_8_ = auVar81._8_8_;
        auVar104._0_8_ = uVar127;
        if (auVar81._8_4_ <= auVar81._0_4_) {
          auVar105._4_12_ = auVar104._4_12_;
          auVar105._0_4_ = auVar81._0_4_;
          uVar127 = auVar105._0_8_;
        }
        fVar146 = auVar138._0_4_;
        fVar182 = ((float)uVar127 - fVar146) * 1.0000002;
        uVar71 = -(uint)(fVar182 / 255.0 == 0.0);
        auVar153._0_8_ = (ulong)uVar71 & 0xffffffff01000000;
        auVar153._8_8_ = 0;
        local_1ea0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                     (auVar153 | ZEXT416(~uVar71 & (uint)(fVar182 / 255.0)));
        fVar163 = (float)(-(uint)(0.0 < fVar182) & (uint)(255.0 / fVar182));
        fVar182 = floorf((fVar134 - fVar146) * fVar163);
        fVar176 = floorf((fVar135 - fVar146) * fVar163);
        fVar181 = floorf((fVar130 - fVar146) * fVar163);
        fVar188 = floorf((fVar133 - fVar146) * fVar163);
        uVar102 = ~((int)fVar181 >> 0x1f) & (int)fVar181;
        uVar124 = ~((int)fVar188 >> 0x1f) & (int)fVar188;
        fVar164 = (float)(~((int)fVar182 >> 0x1f) & (int)fVar182);
        uVar129 = ~((int)fVar176 >> 0x1f) & (int)fVar176;
        local_1e60._4_4_ = uVar124;
        local_1e60._0_4_ = uVar102;
        uStack_1e58._0_4_ = fVar164;
        uStack_1e58._4_4_ = uVar129;
        fVar182 = ceilf((fVar125 - fVar146) * fVar163);
        fVar176 = ceilf((fVar128 - fVar146) * fVar163);
        fVar181 = ceilf((fVar186 - fVar146) * fVar163);
        fVar188 = ceilf((fVar187 - fVar146) * fVar163);
        uVar38 = local_11f0.m128[3];
        uVar37 = local_11f0.m128[2];
        uVar36 = local_11f0.m128[1];
        uVar57 = local_11f0.m128[0];
        uVar71 = -(uint)(0xfe < (int)fVar181);
        uVar96 = -(uint)(0xfe < (int)fVar188);
        uVar98 = -(uint)(0xfe < (int)fVar182);
        uVar100 = -(uint)(0xfe < (int)fVar176);
        uVar75 = uVar71 & 0xff | ~uVar71 & (int)fVar181;
        uVar97 = uVar96 & 0xff | ~uVar96 & (int)fVar188;
        uVar99 = uVar98 & 0xff | ~uVar98 & (int)fVar182;
        uVar101 = uVar100 & 0xff | ~uVar100 & (int)fVar176;
        uVar71 = -(uint)((float)(int)uVar102 * (float)local_1ea0._0_4_ + fVar146 <= fVar130);
        uVar96 = -(uint)((float)(int)uVar124 * (float)local_1ea0._0_4_ + fVar146 <= fVar133);
        uVar98 = -(uint)((float)(int)fVar164 * (float)local_1ea0._0_4_ + fVar146 <= fVar134);
        uVar100 = -(uint)((float)(int)uVar129 * (float)local_1ea0._0_4_ + fVar146 <= fVar135);
        uVar102 = ~uVar71 & uVar102 - 1 | uVar102 & uVar71;
        uVar124 = ~uVar96 & uVar124 - 1 | uVar124 & uVar96;
        uVar126 = ~uVar98 & (int)fVar164 - 1U | (uint)fVar164 & uVar98;
        uVar129 = ~uVar100 & uVar129 - 1 | uVar129 & uVar100;
        uVar71 = -(uint)(fVar186 <= (float)(int)uVar75 * (float)local_1ea0._0_4_ + fVar146);
        uVar96 = -(uint)(fVar187 <= (float)(int)uVar97 * (float)local_1ea0._0_4_ + fVar146);
        uVar98 = -(uint)(fVar125 <= (float)(int)uVar99 * (float)local_1ea0._0_4_ + fVar146);
        uVar100 = -(uint)(fVar128 <= (float)(int)uVar101 * (float)local_1ea0._0_4_ + fVar146);
        uVar75 = ~uVar71 & uVar75 + 1 | uVar75 & uVar71;
        uVar97 = ~uVar96 & uVar97 + 1 | uVar97 & uVar96;
        uVar99 = ~uVar98 & uVar99 + 1 | uVar99 & uVar98;
        uVar101 = ~uVar100 & uVar101 + 1 | uVar101 & uVar100;
        uVar71 = -(uint)(0xfe < (int)uVar75);
        uVar96 = -(uint)(0xfe < (int)uVar97);
        uVar98 = -(uint)(0xfe < (int)uVar99);
        uVar100 = -(uint)(0xfe < (int)uVar101);
        local_1e60._4_4_ = ~uVar72 & 0xff | ~((int)uVar124 >> 0x1f) & uVar124 & uVar72;
        local_1e60._0_4_ = ~uVar40 & 0xff | ~((int)uVar102 >> 0x1f) & uVar102 & uVar40;
        uStack_1e58._0_4_ = ~uVar73 & 0xff | ~((int)uVar126 >> 0x1f) & uVar126 & uVar73;
        uStack_1e58._4_4_ = ~uVar74 & 0xff | ~((int)uVar129 >> 0x1f) & uVar129 & uVar74;
        local_1d90._4_4_ = (uVar96 & 0xff | ~uVar96 & uVar97) & uVar72;
        local_1d90._0_4_ = (uVar71 & 0xff | ~uVar71 & uVar75) & uVar40;
        uStack_1d88._0_4_ = (uVar98 & 0xff | ~uVar98 & uVar99) & uVar73;
        uStack_1d88._4_4_ = (uVar100 & 0xff | ~uVar100 & uVar101) & uVar74;
        lVar41 = 0;
        do {
          pcVar55[lVar41 + 0x20] = local_1e60[lVar41 * 4];
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        lVar41 = 0;
        do {
          pcVar55[lVar41 + 0x24] = local_1d90[lVar41 * 4];
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        *(float *)(pcVar56 + 0x38) = fVar146;
        *(undefined4 *)(pcVar56 + 0x44) = local_1ea0._0_4_;
        fVar182 = local_1200._0_4_;
        fVar176 = local_1200._4_4_;
        fVar181 = local_1200._8_4_;
        fVar188 = local_1200._12_4_;
        auVar32._4_4_ = local_11f0.m128[1];
        auVar32._0_4_ = local_11f0.m128[0];
        auVar32._8_4_ = local_11f0.m128[2];
        auVar32._12_4_ = local_11f0.m128[3];
        uVar40 = -(uint)(fVar182 != INFINITY);
        uVar72 = -(uint)(fVar176 != INFINITY);
        uVar73 = -(uint)(fVar181 != INFINITY);
        uVar74 = -(uint)(fVar188 != INFINITY);
        auVar83._4_4_ = fVar182;
        auVar83._0_4_ = fVar176;
        auVar83._8_4_ = fVar188;
        auVar83._12_4_ = fVar181;
        auVar81 = minps(auVar83,(undefined1  [16])_local_1200);
        auVar139._0_8_ = auVar81._8_8_;
        auVar139._8_4_ = auVar81._0_4_;
        auVar139._12_4_ = auVar81._4_4_;
        auVar138 = minps(auVar139,auVar81);
        auVar84._4_4_ = local_11f0.m128[0];
        auVar84._0_4_ = local_11f0.m128[1];
        auVar84._8_4_ = local_11f0.m128[3];
        auVar84._12_4_ = local_11f0.m128[2];
        auVar81 = maxps(auVar84,auVar32);
        auVar19._4_8_ = auVar32._8_8_;
        auVar19._0_4_ = auVar81._4_4_;
        auVar106._0_8_ = auVar19._0_8_ << 0x20;
        auVar106._8_4_ = auVar81._8_4_;
        auVar106._12_4_ = auVar81._12_4_;
        uVar127 = auVar106._8_8_;
        auVar107._8_8_ = auVar81._8_8_;
        auVar107._0_8_ = uVar127;
        if (auVar81._8_4_ <= auVar81._0_4_) {
          auVar108._4_12_ = auVar107._4_12_;
          auVar108._0_4_ = auVar81._0_4_;
          uVar127 = auVar108._0_8_;
        }
        fVar146 = auVar138._0_4_;
        fVar186 = ((float)uVar127 - fVar146) * 1.0000002;
        uVar71 = -(uint)(fVar186 / 255.0 == 0.0);
        auVar154._0_8_ = (ulong)uVar71 & 0xffffffff01000000;
        auVar154._8_8_ = 0;
        local_1ea0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                     (auVar154 | ZEXT416(~uVar71 & (uint)(fVar186 / 255.0)));
        fVar135 = (float)(-(uint)(0.0 < fVar186) & (uint)(255.0 / fVar186));
        fVar186 = floorf((fVar181 - fVar146) * fVar135);
        fVar187 = floorf((fVar188 - fVar146) * fVar135);
        fVar125 = floorf((fVar182 - fVar146) * fVar135);
        fVar128 = floorf((fVar176 - fVar146) * fVar135);
        uVar102 = ~((int)fVar125 >> 0x1f) & (int)fVar125;
        uVar124 = ~((int)fVar128 >> 0x1f) & (int)fVar128;
        fVar164 = (float)(~((int)fVar186 >> 0x1f) & (int)fVar186);
        uVar129 = ~((int)fVar187 >> 0x1f) & (int)fVar187;
        local_1e60._4_4_ = uVar124;
        local_1e60._0_4_ = uVar102;
        uStack_1e58._0_4_ = fVar164;
        uStack_1e58._4_4_ = uVar129;
        fVar130 = ceilf(((float)uVar37 - fVar146) * fVar135);
        fVar133 = ceilf(((float)uVar38 - fVar146) * fVar135);
        fVar134 = ceilf(((float)uVar57 - fVar146) * fVar135);
        fVar135 = ceilf(((float)uVar36 - fVar146) * fVar135);
        fVar128 = uStack_11c8._4_4_;
        fVar125 = (float)uStack_11c8;
        fVar187 = local_11d0[1];
        fVar186 = local_11d0[0];
        uVar71 = -(uint)(0xfe < (int)fVar134);
        uVar96 = -(uint)(0xfe < (int)fVar135);
        uVar98 = -(uint)(0xfe < (int)fVar130);
        uVar100 = -(uint)(0xfe < (int)fVar133);
        uVar75 = uVar71 & 0xff | ~uVar71 & (int)fVar134;
        uVar97 = uVar96 & 0xff | ~uVar96 & (int)fVar135;
        uVar99 = uVar98 & 0xff | ~uVar98 & (int)fVar130;
        uVar101 = uVar100 & 0xff | ~uVar100 & (int)fVar133;
        uVar71 = -(uint)((float)(int)uVar102 * (float)local_1ea0._0_4_ + fVar146 <= fVar182);
        uVar96 = -(uint)((float)(int)uVar124 * (float)local_1ea0._0_4_ + fVar146 <= fVar176);
        uVar98 = -(uint)((float)(int)fVar164 * (float)local_1ea0._0_4_ + fVar146 <= fVar181);
        uVar100 = -(uint)((float)(int)uVar129 * (float)local_1ea0._0_4_ + fVar146 <= fVar188);
        uVar102 = ~uVar71 & uVar102 - 1 | uVar102 & uVar71;
        uVar124 = ~uVar96 & uVar124 - 1 | uVar124 & uVar96;
        uVar126 = ~uVar98 & (int)fVar164 - 1U | (uint)fVar164 & uVar98;
        uVar129 = ~uVar100 & uVar129 - 1 | uVar129 & uVar100;
        uVar71 = -(uint)((float)uVar57 <= (float)(int)uVar75 * (float)local_1ea0._0_4_ + fVar146);
        uVar96 = -(uint)((float)uVar36 <= (float)(int)uVar97 * (float)local_1ea0._0_4_ + fVar146);
        uVar98 = -(uint)((float)uVar37 <= (float)(int)uVar99 * (float)local_1ea0._0_4_ + fVar146);
        uVar100 = -(uint)((float)uVar38 <= (float)(int)uVar101 * (float)local_1ea0._0_4_ + fVar146);
        uVar75 = ~uVar71 & uVar75 + 1 | uVar75 & uVar71;
        uVar97 = ~uVar96 & uVar97 + 1 | uVar97 & uVar96;
        uVar99 = ~uVar98 & uVar99 + 1 | uVar99 & uVar98;
        uVar101 = ~uVar100 & uVar101 + 1 | uVar101 & uVar100;
        uVar71 = -(uint)(0xfe < (int)uVar75);
        uVar96 = -(uint)(0xfe < (int)uVar97);
        uVar98 = -(uint)(0xfe < (int)uVar99);
        uVar100 = -(uint)(0xfe < (int)uVar101);
        local_1e60._4_4_ = ~uVar72 & 0xff | ~((int)uVar124 >> 0x1f) & uVar124 & uVar72;
        local_1e60._0_4_ = ~uVar40 & 0xff | ~((int)uVar102 >> 0x1f) & uVar102 & uVar40;
        uStack_1e58._0_4_ = ~uVar73 & 0xff | ~((int)uVar126 >> 0x1f) & uVar126 & uVar73;
        uStack_1e58._4_4_ = ~uVar74 & 0xff | ~((int)uVar129 >> 0x1f) & uVar129 & uVar74;
        local_1d90._4_4_ = (uVar96 & 0xff | ~uVar96 & uVar97) & uVar72;
        local_1d90._0_4_ = (uVar71 & 0xff | ~uVar71 & uVar75) & uVar40;
        uStack_1d88._0_4_ = (uVar98 & 0xff | ~uVar98 & uVar99) & uVar73;
        uStack_1d88._4_4_ = (uVar100 & 0xff | ~uVar100 & uVar101) & uVar74;
        lVar41 = 0;
        do {
          pcVar55[lVar41 + 0x28] = local_1e60[lVar41 * 4];
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        lVar41 = 0;
        do {
          pcVar55[lVar41 + 0x2c] = local_1d90[lVar41 * 4];
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        *(float *)(pcVar56 + 0x3c) = fVar146;
        *(undefined4 *)(pcVar56 + 0x48) = local_1ea0._0_4_;
        fVar182 = local_11e0._0_4_;
        fVar176 = local_11e0._4_4_;
        fVar181 = local_11e0._8_4_;
        fVar188 = local_11e0._12_4_;
        auVar33._4_4_ = local_11d0[1];
        auVar33._0_4_ = local_11d0[0];
        auVar33._8_4_ = (float)uStack_11c8;
        auVar33._12_4_ = uStack_11c8._4_4_;
        uVar40 = -(uint)(fVar182 != INFINITY);
        uVar72 = -(uint)(fVar176 != INFINITY);
        uVar73 = -(uint)(fVar181 != INFINITY);
        uVar74 = -(uint)(fVar188 != INFINITY);
        auVar85._4_4_ = fVar182;
        auVar85._0_4_ = fVar176;
        auVar85._8_4_ = fVar188;
        auVar85._12_4_ = fVar181;
        auVar81 = minps(auVar85,(undefined1  [16])_local_11e0);
        auVar140._0_8_ = auVar81._8_8_;
        auVar140._8_4_ = auVar81._0_4_;
        auVar140._12_4_ = auVar81._4_4_;
        auVar138 = minps(auVar140,auVar81);
        auVar86._4_4_ = local_11d0[0];
        auVar86._0_4_ = local_11d0[1];
        auVar86._8_4_ = uStack_11c8._4_4_;
        auVar86._12_4_ = (float)uStack_11c8;
        auVar81 = maxps(auVar86,auVar33);
        auVar20._4_8_ = auVar33._8_8_;
        auVar20._0_4_ = auVar81._4_4_;
        auVar109._0_8_ = auVar20._0_8_ << 0x20;
        auVar109._8_4_ = auVar81._8_4_;
        auVar109._12_4_ = auVar81._12_4_;
        uVar127 = auVar109._8_8_;
        auVar110._8_8_ = auVar81._8_8_;
        auVar110._0_8_ = uVar127;
        if (auVar81._8_4_ <= auVar81._0_4_) {
          auVar111._4_12_ = auVar110._4_12_;
          auVar111._0_4_ = auVar81._0_4_;
          uVar127 = auVar111._0_8_;
        }
        fVar136 = auVar138._0_4_;
        fVar130 = ((float)uVar127 - fVar136) * 1.0000002;
        uVar71 = -(uint)(fVar130 / 255.0 == 0.0);
        auVar155._0_8_ = (ulong)uVar71 & 0xffffffff01000000;
        auVar155._8_8_ = 0;
        local_1ea0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                     (auVar155 | ZEXT416(~uVar71 & (uint)(fVar130 / 255.0)));
        fVar164 = (float)(-(uint)(0.0 < fVar130) & (uint)(255.0 / fVar130));
        fVar130 = floorf((fVar181 - fVar136) * fVar164);
        fVar133 = floorf((fVar188 - fVar136) * fVar164);
        fVar134 = floorf((fVar182 - fVar136) * fVar164);
        fVar135 = floorf((fVar176 - fVar136) * fVar164);
        uVar102 = ~((int)fVar134 >> 0x1f) & (int)fVar134;
        uVar124 = ~((int)fVar135 >> 0x1f) & (int)fVar135;
        fVar161 = (float)(~((int)fVar130 >> 0x1f) & (int)fVar130);
        uVar129 = ~((int)fVar133 >> 0x1f) & (int)fVar133;
        local_1e60._4_4_ = uVar124;
        local_1e60._0_4_ = uVar102;
        uStack_1e58._0_4_ = fVar161;
        uStack_1e58._4_4_ = uVar129;
        fVar76 = ceilf((fVar125 - fVar136) * fVar164);
        fVar77 = ceilf((fVar128 - fVar136) * fVar164);
        fVar78 = ceilf((fVar186 - fVar136) * fVar164);
        fVar79 = ceilf((fVar187 - fVar136) * fVar164);
        fVar185 = local_1810[3];
        fVar163 = local_1810[2];
        fVar146 = local_1810[1];
        fVar164 = local_1810[0];
        fVar135 = local_1820[3];
        fVar134 = local_1820[2];
        fVar133 = local_1820[1];
        fVar130 = local_1820[0];
        uVar71 = -(uint)(0xfe < (int)fVar78);
        uVar96 = -(uint)(0xfe < (int)fVar79);
        uVar98 = -(uint)(0xfe < (int)fVar76);
        uVar100 = -(uint)(0xfe < (int)fVar77);
        uVar75 = uVar71 & 0xff | ~uVar71 & (int)fVar78;
        uVar97 = uVar96 & 0xff | ~uVar96 & (int)fVar79;
        uVar99 = uVar98 & 0xff | ~uVar98 & (int)fVar76;
        uVar101 = uVar100 & 0xff | ~uVar100 & (int)fVar77;
        uVar71 = -(uint)((float)(int)uVar102 * (float)local_1ea0._0_4_ + fVar136 <= fVar182);
        uVar96 = -(uint)((float)(int)uVar124 * (float)local_1ea0._0_4_ + fVar136 <= fVar176);
        uVar98 = -(uint)((float)(int)fVar161 * (float)local_1ea0._0_4_ + fVar136 <= fVar181);
        uVar100 = -(uint)((float)(int)uVar129 * (float)local_1ea0._0_4_ + fVar136 <= fVar188);
        uVar102 = ~uVar71 & uVar102 - 1 | uVar102 & uVar71;
        uVar124 = ~uVar96 & uVar124 - 1 | uVar124 & uVar96;
        uVar126 = ~uVar98 & (int)fVar161 - 1U | (uint)fVar161 & uVar98;
        uVar129 = ~uVar100 & uVar129 - 1 | uVar129 & uVar100;
        uVar71 = -(uint)(fVar186 <= (float)(int)uVar75 * (float)local_1ea0._0_4_ + fVar136);
        uVar96 = -(uint)(fVar187 <= (float)(int)uVar97 * (float)local_1ea0._0_4_ + fVar136);
        uVar98 = -(uint)(fVar125 <= (float)(int)uVar99 * (float)local_1ea0._0_4_ + fVar136);
        uVar100 = -(uint)(fVar128 <= (float)(int)uVar101 * (float)local_1ea0._0_4_ + fVar136);
        uVar75 = ~uVar71 & uVar75 + 1 | uVar75 & uVar71;
        uVar97 = ~uVar96 & uVar97 + 1 | uVar97 & uVar96;
        uVar99 = ~uVar98 & uVar99 + 1 | uVar99 & uVar98;
        uVar101 = ~uVar100 & uVar101 + 1 | uVar101 & uVar100;
        uVar71 = -(uint)(0xfe < (int)uVar75);
        uVar96 = -(uint)(0xfe < (int)uVar97);
        uVar98 = -(uint)(0xfe < (int)uVar99);
        uVar100 = -(uint)(0xfe < (int)uVar101);
        local_1e60._4_4_ = ~uVar72 & 0xff | ~((int)uVar124 >> 0x1f) & uVar124 & uVar72;
        local_1e60._0_4_ = ~uVar40 & 0xff | ~((int)uVar102 >> 0x1f) & uVar102 & uVar40;
        uStack_1e58._0_4_ = ~uVar73 & 0xff | ~((int)uVar126 >> 0x1f) & uVar126 & uVar73;
        uStack_1e58._4_4_ = ~uVar74 & 0xff | ~((int)uVar129 >> 0x1f) & uVar129 & uVar74;
        local_1d90._4_4_ = (uVar96 & 0xff | ~uVar96 & uVar97) & uVar72;
        local_1d90._0_4_ = (uVar71 & 0xff | ~uVar71 & uVar75) & uVar40;
        uStack_1d88._0_4_ = (uVar98 & 0xff | ~uVar98 & uVar99) & uVar73;
        uStack_1d88._4_4_ = (uVar100 & 0xff | ~uVar100 & uVar101) & uVar74;
        lVar41 = 0;
        do {
          pcVar55[lVar41 + 0x30] = local_1e60[lVar41 * 4];
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        lVar41 = 0;
        do {
          pcVar55[lVar41 + 0x34] = local_1d90[lVar41 * 4];
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        *(float *)(pcVar56 + 0x40) = fVar136;
        *(undefined4 *)(pcVar56 + 0x4c) = local_1ea0._0_4_;
        auVar26._4_4_ = local_1820[1];
        auVar26._0_4_ = local_1820[0];
        auVar26._8_4_ = local_1820[2];
        auVar26._12_4_ = local_1820[3];
        auVar27._4_4_ = local_1810[1];
        auVar27._0_4_ = local_1810[0];
        auVar27._8_4_ = local_1810[2];
        auVar27._12_4_ = local_1810[3];
        uVar40 = -(uint)(local_1820[0] != INFINITY);
        uVar72 = -(uint)(local_1820[1] != INFINITY);
        uVar73 = -(uint)(local_1820[2] != INFINITY);
        uVar74 = -(uint)(local_1820[3] != INFINITY);
        auVar87._4_4_ = local_1820[0];
        auVar87._0_4_ = local_1820[1];
        auVar87._8_4_ = local_1820[3];
        auVar87._12_4_ = local_1820[2];
        auVar81 = minps(auVar87,auVar26);
        auVar141._0_8_ = auVar81._8_8_;
        auVar141._8_4_ = auVar81._0_4_;
        auVar141._12_4_ = auVar81._4_4_;
        auVar138 = minps(auVar141,auVar81);
        auVar88._4_4_ = local_1810[0];
        auVar88._0_4_ = local_1810[1];
        auVar88._8_4_ = local_1810[3];
        auVar88._12_4_ = local_1810[2];
        auVar81 = maxps(auVar88,auVar27);
        auVar21._4_8_ = auVar27._8_8_;
        auVar21._0_4_ = auVar81._4_4_;
        auVar112._0_8_ = auVar21._0_8_ << 0x20;
        auVar112._8_4_ = auVar81._8_4_;
        auVar112._12_4_ = auVar81._12_4_;
        uVar127 = auVar112._8_8_;
        auVar113._8_8_ = auVar81._8_8_;
        auVar113._0_8_ = uVar127;
        if (auVar81._8_4_ <= auVar81._0_4_) {
          auVar114._4_12_ = auVar113._4_12_;
          auVar114._0_4_ = auVar81._0_4_;
          uVar127 = auVar114._0_8_;
        }
        fVar136 = auVar138._0_4_;
        fVar182 = ((float)uVar127 - fVar136) * 1.0000002;
        uVar71 = -(uint)(fVar182 / 255.0 == 0.0);
        auVar156._0_8_ = (ulong)uVar71 & 0xffffffff01000000;
        auVar156._8_8_ = 0;
        local_1ea0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                     (auVar156 | ZEXT416(~uVar71 & (uint)(fVar182 / 255.0)));
        fVar186 = (float)(-(uint)(0.0 < fVar182) & (uint)(255.0 / fVar182));
        fVar182 = local_1820[0] - fVar136;
        fVar188 = local_1820[1] - fVar136;
        fVar181 = local_1820[3] - fVar136;
        fVar176 = floorf((local_1820[2] - fVar136) * fVar186);
        fVar181 = floorf(fVar181 * fVar186);
        fVar182 = floorf(fVar182 * fVar186);
        fVar188 = floorf(fVar188 * fVar186);
        uVar102 = ~((int)fVar182 >> 0x1f) & (int)fVar182;
        uVar124 = ~((int)fVar188 >> 0x1f) & (int)fVar188;
        fVar161 = (float)(~((int)fVar176 >> 0x1f) & (int)fVar176);
        uVar129 = ~((int)fVar181 >> 0x1f) & (int)fVar181;
        local_1e60._4_4_ = uVar124;
        local_1e60._0_4_ = uVar102;
        uStack_1e58._0_4_ = fVar161;
        uStack_1e58._4_4_ = uVar129;
        fVar76 = ceilf((fVar163 - fVar136) * fVar186);
        fVar77 = ceilf((fVar185 - fVar136) * fVar186);
        fVar78 = ceilf((fVar164 - fVar136) * fVar186);
        fVar79 = ceilf((fVar146 - fVar136) * fVar186);
        fVar128 = local_17f0[3];
        fVar125 = local_17f0[2];
        fVar187 = local_17f0[1];
        fVar186 = local_17f0[0];
        fVar188 = local_1800[3];
        fVar181 = local_1800[2];
        fVar176 = local_1800[1];
        fVar182 = local_1800[0];
        uVar71 = -(uint)(0xfe < (int)fVar78);
        uVar96 = -(uint)(0xfe < (int)fVar79);
        uVar98 = -(uint)(0xfe < (int)fVar76);
        uVar100 = -(uint)(0xfe < (int)fVar77);
        uVar75 = uVar71 & 0xff | ~uVar71 & (int)fVar78;
        uVar97 = uVar96 & 0xff | ~uVar96 & (int)fVar79;
        uVar99 = uVar98 & 0xff | ~uVar98 & (int)fVar76;
        uVar101 = uVar100 & 0xff | ~uVar100 & (int)fVar77;
        uVar71 = -(uint)((float)(int)uVar102 * (float)local_1ea0._0_4_ + fVar136 <= fVar130);
        uVar96 = -(uint)((float)(int)uVar124 * (float)local_1ea0._0_4_ + fVar136 <= fVar133);
        uVar98 = -(uint)((float)(int)fVar161 * (float)local_1ea0._0_4_ + fVar136 <= fVar134);
        uVar100 = -(uint)((float)(int)uVar129 * (float)local_1ea0._0_4_ + fVar136 <= fVar135);
        uVar102 = ~uVar71 & uVar102 - 1 | uVar102 & uVar71;
        uVar124 = ~uVar96 & uVar124 - 1 | uVar124 & uVar96;
        uVar126 = ~uVar98 & (int)fVar161 - 1U | (uint)fVar161 & uVar98;
        uVar129 = ~uVar100 & uVar129 - 1 | uVar129 & uVar100;
        uVar71 = -(uint)(fVar164 <= (float)(int)uVar75 * (float)local_1ea0._0_4_ + fVar136);
        uVar96 = -(uint)(fVar146 <= (float)(int)uVar97 * (float)local_1ea0._0_4_ + fVar136);
        uVar98 = -(uint)(fVar163 <= (float)(int)uVar99 * (float)local_1ea0._0_4_ + fVar136);
        uVar100 = -(uint)(fVar185 <= (float)(int)uVar101 * (float)local_1ea0._0_4_ + fVar136);
        uVar75 = ~uVar71 & uVar75 + 1 | uVar75 & uVar71;
        uVar97 = ~uVar96 & uVar97 + 1 | uVar97 & uVar96;
        uVar99 = ~uVar98 & uVar99 + 1 | uVar99 & uVar98;
        uVar101 = ~uVar100 & uVar101 + 1 | uVar101 & uVar100;
        uVar71 = -(uint)(0xfe < (int)uVar75);
        uVar96 = -(uint)(0xfe < (int)uVar97);
        uVar98 = -(uint)(0xfe < (int)uVar99);
        uVar100 = -(uint)(0xfe < (int)uVar101);
        local_1e60._4_4_ = ~uVar72 & 0xff | ~((int)uVar124 >> 0x1f) & uVar124 & uVar72;
        local_1e60._0_4_ = ~uVar40 & 0xff | ~((int)uVar102 >> 0x1f) & uVar102 & uVar40;
        uStack_1e58._0_4_ = ~uVar73 & 0xff | ~((int)uVar126 >> 0x1f) & uVar126 & uVar73;
        uStack_1e58._4_4_ = ~uVar74 & 0xff | ~((int)uVar129 >> 0x1f) & uVar129 & uVar74;
        local_1d90._4_4_ = (uVar96 & 0xff | ~uVar96 & uVar97) & uVar72;
        local_1d90._0_4_ = (uVar71 & 0xff | ~uVar71 & uVar75) & uVar40;
        uStack_1d88._0_4_ = (uVar98 & 0xff | ~uVar98 & uVar99) & uVar73;
        uStack_1d88._4_4_ = (uVar100 & 0xff | ~uVar100 & uVar101) & uVar74;
        lVar41 = 0;
        do {
          pcVar55[lVar41 + 0x50] = local_1e60[lVar41 * 4];
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        lVar41 = 0;
        do {
          pcVar55[lVar41 + 0x54] = local_1d90[lVar41 * 4];
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        *(float *)(pcVar56 + 0x68) = fVar136;
        *(undefined4 *)(pcVar56 + 0x74) = local_1ea0._0_4_;
        auVar28._4_4_ = local_1800[1];
        auVar28._0_4_ = local_1800[0];
        auVar28._8_4_ = local_1800[2];
        auVar28._12_4_ = local_1800[3];
        auVar29._4_4_ = local_17f0[1];
        auVar29._0_4_ = local_17f0[0];
        auVar29._8_4_ = local_17f0[2];
        auVar29._12_4_ = local_17f0[3];
        uVar40 = -(uint)(local_1800[0] != INFINITY);
        uVar72 = -(uint)(local_1800[1] != INFINITY);
        uVar73 = -(uint)(local_1800[2] != INFINITY);
        uVar74 = -(uint)(local_1800[3] != INFINITY);
        auVar89._4_4_ = local_1800[0];
        auVar89._0_4_ = local_1800[1];
        auVar89._8_4_ = local_1800[3];
        auVar89._12_4_ = local_1800[2];
        auVar81 = minps(auVar89,auVar28);
        auVar142._0_8_ = auVar81._8_8_;
        auVar142._8_4_ = auVar81._0_4_;
        auVar142._12_4_ = auVar81._4_4_;
        auVar138 = minps(auVar142,auVar81);
        auVar90._4_4_ = local_17f0[0];
        auVar90._0_4_ = local_17f0[1];
        auVar90._8_4_ = local_17f0[3];
        auVar90._12_4_ = local_17f0[2];
        auVar81 = maxps(auVar90,auVar29);
        auVar22._4_8_ = auVar29._8_8_;
        auVar22._0_4_ = auVar81._4_4_;
        auVar115._0_8_ = auVar22._0_8_ << 0x20;
        auVar115._8_4_ = auVar81._8_4_;
        auVar115._12_4_ = auVar81._12_4_;
        uVar127 = auVar115._8_8_;
        auVar116._8_8_ = auVar81._8_8_;
        auVar116._0_8_ = uVar127;
        if (auVar81._8_4_ <= auVar81._0_4_) {
          auVar117._4_12_ = auVar116._4_12_;
          auVar117._0_4_ = auVar81._0_4_;
          uVar127 = auVar117._0_8_;
        }
        fVar136 = auVar138._0_4_;
        fVar130 = ((float)uVar127 - fVar136) * 1.0000002;
        uVar71 = -(uint)(fVar130 / 255.0 == 0.0);
        auVar157._0_8_ = (ulong)uVar71 & 0xffffffff01000000;
        auVar157._8_8_ = 0;
        local_1ea0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                     (auVar157 | ZEXT416(~uVar71 & (uint)(fVar130 / 255.0)));
        fVar164 = (float)(-(uint)(0.0 < fVar130) & (uint)(255.0 / fVar130));
        fVar130 = local_1800[0] - fVar136;
        fVar135 = local_1800[1] - fVar136;
        fVar134 = local_1800[3] - fVar136;
        fVar133 = floorf((local_1800[2] - fVar136) * fVar164);
        fVar134 = floorf(fVar134 * fVar164);
        fVar130 = floorf(fVar130 * fVar164);
        fVar135 = floorf(fVar135 * fVar164);
        uVar102 = ~((int)fVar130 >> 0x1f) & (int)fVar130;
        uVar124 = ~((int)fVar135 >> 0x1f) & (int)fVar135;
        fVar161 = (float)(~((int)fVar133 >> 0x1f) & (int)fVar133);
        uVar129 = ~((int)fVar134 >> 0x1f) & (int)fVar134;
        local_1e60._4_4_ = uVar124;
        local_1e60._0_4_ = uVar102;
        uStack_1e58._0_4_ = fVar161;
        uStack_1e58._4_4_ = uVar129;
        fVar76 = ceilf((fVar125 - fVar136) * fVar164);
        fVar77 = ceilf((fVar128 - fVar136) * fVar164);
        fVar78 = ceilf((fVar186 - fVar136) * fVar164);
        fVar79 = ceilf((fVar187 - fVar136) * fVar164);
        fVar185 = local_17d0[3];
        fVar163 = local_17d0[2];
        fVar146 = local_17d0[1];
        fVar164 = local_17d0[0];
        fVar135 = local_17e0[3];
        fVar134 = local_17e0[2];
        fVar133 = local_17e0[1];
        fVar130 = local_17e0[0];
        uVar71 = -(uint)(0xfe < (int)fVar78);
        uVar96 = -(uint)(0xfe < (int)fVar79);
        uVar98 = -(uint)(0xfe < (int)fVar76);
        uVar100 = -(uint)(0xfe < (int)fVar77);
        uVar75 = uVar71 & 0xff | ~uVar71 & (int)fVar78;
        uVar97 = uVar96 & 0xff | ~uVar96 & (int)fVar79;
        uVar99 = uVar98 & 0xff | ~uVar98 & (int)fVar76;
        uVar101 = uVar100 & 0xff | ~uVar100 & (int)fVar77;
        uVar71 = -(uint)((float)(int)uVar102 * (float)local_1ea0._0_4_ + fVar136 <= fVar182);
        uVar96 = -(uint)((float)(int)uVar124 * (float)local_1ea0._0_4_ + fVar136 <= fVar176);
        uVar98 = -(uint)((float)(int)fVar161 * (float)local_1ea0._0_4_ + fVar136 <= fVar181);
        uVar100 = -(uint)((float)(int)uVar129 * (float)local_1ea0._0_4_ + fVar136 <= fVar188);
        uVar102 = ~uVar71 & uVar102 - 1 | uVar102 & uVar71;
        uVar124 = ~uVar96 & uVar124 - 1 | uVar124 & uVar96;
        uVar126 = ~uVar98 & (int)fVar161 - 1U | (uint)fVar161 & uVar98;
        uVar129 = ~uVar100 & uVar129 - 1 | uVar129 & uVar100;
        uVar71 = -(uint)(fVar186 <= (float)(int)uVar75 * (float)local_1ea0._0_4_ + fVar136);
        uVar96 = -(uint)(fVar187 <= (float)(int)uVar97 * (float)local_1ea0._0_4_ + fVar136);
        uVar98 = -(uint)(fVar125 <= (float)(int)uVar99 * (float)local_1ea0._0_4_ + fVar136);
        uVar100 = -(uint)(fVar128 <= (float)(int)uVar101 * (float)local_1ea0._0_4_ + fVar136);
        uVar75 = ~uVar71 & uVar75 + 1 | uVar75 & uVar71;
        uVar97 = ~uVar96 & uVar97 + 1 | uVar97 & uVar96;
        uVar99 = ~uVar98 & uVar99 + 1 | uVar99 & uVar98;
        uVar101 = ~uVar100 & uVar101 + 1 | uVar101 & uVar100;
        uVar71 = -(uint)(0xfe < (int)uVar75);
        uVar96 = -(uint)(0xfe < (int)uVar97);
        uVar98 = -(uint)(0xfe < (int)uVar99);
        uVar100 = -(uint)(0xfe < (int)uVar101);
        local_1e60._4_4_ = ~uVar72 & 0xff | ~((int)uVar124 >> 0x1f) & uVar124 & uVar72;
        local_1e60._0_4_ = ~uVar40 & 0xff | ~((int)uVar102 >> 0x1f) & uVar102 & uVar40;
        uStack_1e58._0_4_ = ~uVar73 & 0xff | ~((int)uVar126 >> 0x1f) & uVar126 & uVar73;
        uStack_1e58._4_4_ = ~uVar74 & 0xff | ~((int)uVar129 >> 0x1f) & uVar129 & uVar74;
        local_1d90._4_4_ = (uVar96 & 0xff | ~uVar96 & uVar97) & uVar72;
        local_1d90._0_4_ = (uVar71 & 0xff | ~uVar71 & uVar75) & uVar40;
        uStack_1d88._0_4_ = (uVar98 & 0xff | ~uVar98 & uVar99) & uVar73;
        uStack_1d88._4_4_ = (uVar100 & 0xff | ~uVar100 & uVar101) & uVar74;
        lVar41 = 0;
        do {
          pcVar55[lVar41 + 0x58] = local_1e60[lVar41 * 4];
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        lVar41 = 0;
        do {
          pcVar55[lVar41 + 0x5c] = local_1d90[lVar41 * 4];
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        *(float *)(pcVar56 + 0x6c) = fVar136;
        *(undefined4 *)(pcVar56 + 0x78) = local_1ea0._0_4_;
        auVar30._4_4_ = local_17e0[1];
        auVar30._0_4_ = local_17e0[0];
        auVar30._8_4_ = local_17e0[2];
        auVar30._12_4_ = local_17e0[3];
        auVar31._4_4_ = local_17d0[1];
        auVar31._0_4_ = local_17d0[0];
        auVar31._8_4_ = local_17d0[2];
        auVar31._12_4_ = local_17d0[3];
        bVar69 = local_17e0[0] != INFINITY;
        bVar70 = local_17e0[1] != INFINITY;
        bVar15 = local_17e0[2] != INFINITY;
        bVar16 = local_17e0[3] != INFINITY;
        auVar91._4_4_ = local_17e0[0];
        auVar91._0_4_ = local_17e0[1];
        auVar91._8_4_ = local_17e0[3];
        auVar91._12_4_ = local_17e0[2];
        auVar81 = minps(auVar91,auVar30);
        auVar143._0_8_ = auVar81._8_8_;
        auVar143._8_4_ = auVar81._0_4_;
        auVar143._12_4_ = auVar81._4_4_;
        auVar138 = minps(auVar143,auVar81);
        auVar92._4_4_ = local_17d0[0];
        auVar92._0_4_ = local_17d0[1];
        auVar92._8_4_ = local_17d0[3];
        auVar92._12_4_ = local_17d0[2];
        auVar81 = maxps(auVar92,auVar31);
        auVar23._4_8_ = auVar31._8_8_;
        auVar23._0_4_ = auVar81._4_4_;
        auVar118._0_8_ = auVar23._0_8_ << 0x20;
        auVar118._8_4_ = auVar81._8_4_;
        auVar118._12_4_ = auVar81._12_4_;
        uVar127 = auVar118._8_8_;
        auVar119._8_8_ = auVar81._8_8_;
        auVar119._0_8_ = uVar127;
        if (auVar81._8_4_ <= auVar81._0_4_) {
          auVar120._4_12_ = auVar119._4_12_;
          auVar120._0_4_ = auVar81._0_4_;
          uVar127 = auVar120._0_8_;
        }
        fVar187 = auVar138._0_4_;
        fVar182 = ((float)uVar127 - fVar187) * 1.0000002;
        uVar40 = -(uint)(fVar182 / 255.0 == 0.0);
        auVar158._0_8_ = (ulong)uVar40 & 0xffffffff01000000;
        auVar158._8_8_ = 0;
        local_1ea0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                     (auVar158 | ZEXT416(~uVar40 & (uint)(fVar182 / 255.0)));
        fVar125 = (float)(-(uint)(0.0 < fVar182) & (uint)(255.0 / fVar182));
        fVar182 = local_17e0[0] - fVar187;
        fVar188 = local_17e0[1] - fVar187;
        fVar181 = local_17e0[3] - fVar187;
        fVar176 = floorf((local_17e0[2] - fVar187) * fVar125);
        fVar181 = floorf(fVar181 * fVar125);
        fVar182 = floorf(fVar182 * fVar125);
        fVar188 = floorf(fVar188 * fVar125);
        uVar75 = ~((int)fVar182 >> 0x1f) & (int)fVar182;
        uVar97 = ~((int)fVar188 >> 0x1f) & (int)fVar188;
        fVar186 = (float)(~((int)fVar176 >> 0x1f) & (int)fVar176);
        uVar99 = ~((int)fVar181 >> 0x1f) & (int)fVar181;
        local_1e60._4_4_ = uVar97;
        local_1e60._0_4_ = uVar75;
        uStack_1e58._0_4_ = fVar186;
        uStack_1e58._4_4_ = uVar99;
        fVar182 = ceilf((fVar163 - fVar187) * fVar125);
        fVar176 = ceilf((fVar185 - fVar187) * fVar125);
        fVar181 = ceilf((fVar164 - fVar187) * fVar125);
        fVar188 = ceilf((fVar146 - fVar187) * fVar125);
        fVar125 = local_1ea0.m128[0];
        auVar121._0_4_ = (int)fVar181;
        auVar121._4_4_ = (int)fVar188;
        auVar121._8_4_ = (int)fVar182;
        auVar121._12_4_ = (int)fVar176;
        auVar93._0_4_ = -(uint)((int)DAT_01ffd520 < auVar121._0_4_);
        auVar93._4_4_ = -(uint)(DAT_01ffd520._4_4_ < auVar121._4_4_);
        auVar93._8_4_ = -(uint)(DAT_01ffd520._8_4_ < auVar121._8_4_);
        auVar93._12_4_ = -(uint)(DAT_01ffd520._12_4_ < auVar121._12_4_);
        auVar81 = auVar93 & _DAT_01ffd530 | ~auVar93 & auVar121;
        uVar71 = auVar81._0_4_;
        uVar96 = auVar81._4_4_;
        uVar98 = auVar81._8_4_;
        uVar100 = auVar81._12_4_;
        uVar40 = -(uint)((float)(int)uVar75 * fVar125 + fVar187 <= fVar130);
        uVar72 = -(uint)((float)(int)uVar97 * fVar125 + fVar187 <= fVar133);
        uVar73 = -(uint)((float)(int)fVar186 * fVar125 + fVar187 <= fVar134);
        uVar74 = -(uint)((float)(int)uVar99 * fVar125 + fVar187 <= fVar135);
        auVar173._0_4_ = uVar75 & uVar40;
        auVar173._4_4_ = uVar97 & uVar72;
        auVar173._8_4_ = (uint)fVar186 & uVar73;
        auVar173._12_4_ = uVar99 & uVar74;
        auVar122._0_4_ = ~uVar40 & uVar75 - 1;
        auVar122._4_4_ = ~uVar72 & uVar97 - 1;
        auVar122._8_4_ = ~uVar73 & (int)fVar186 - 1U;
        auVar122._12_4_ = ~uVar74 & uVar99 - 1;
        auVar122 = auVar122 | auVar173;
        auVar131._0_4_ = auVar122._0_4_ >> 0x1f;
        auVar131._4_4_ = auVar122._4_4_ >> 0x1f;
        auVar131._8_4_ = auVar122._8_4_ >> 0x1f;
        auVar131._12_4_ = auVar122._12_4_ >> 0x1f;
        uVar40 = -(uint)(fVar164 <= (float)(int)uVar71 * fVar125 + fVar187);
        uVar72 = -(uint)(fVar146 <= (float)(int)uVar96 * fVar125 + fVar187);
        uVar73 = -(uint)(fVar163 <= (float)(int)uVar98 * fVar125 + fVar187);
        uVar74 = -(uint)(fVar185 <= (float)(int)uVar100 * fVar125 + fVar187);
        auVar94._0_4_ = uVar71 & uVar40;
        auVar94._4_4_ = uVar96 & uVar72;
        auVar94._8_4_ = uVar98 & uVar73;
        auVar94._12_4_ = uVar100 & uVar74;
        auVar144._0_4_ = ~uVar40 & uVar71 + 1;
        auVar144._4_4_ = ~uVar72 & uVar96 + 1;
        auVar144._8_4_ = ~uVar73 & uVar98 + 1;
        auVar144._12_4_ = ~uVar74 & uVar100 + 1;
        auVar144 = auVar144 | auVar94;
        auVar95._0_4_ = -(uint)((int)DAT_01ffd520 < auVar144._0_4_);
        auVar95._4_4_ = -(uint)(DAT_01ffd520._4_4_ < auVar144._4_4_);
        auVar95._8_4_ = -(uint)(DAT_01ffd520._8_4_ < auVar144._8_4_);
        auVar95._12_4_ = -(uint)(DAT_01ffd520._12_4_ < auVar144._12_4_);
        auVar25._4_4_ = -(uint)bVar70;
        auVar25._0_4_ = -(uint)bVar69;
        auVar25._8_4_ = -(uint)bVar15;
        auVar25._12_4_ = -(uint)bVar16;
        _local_1e60 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                      (~auVar25 & _DAT_01ffd530 | ~auVar131 & auVar122 & auVar25);
        _local_1d90 = (anon_union_16_2_47237d3f_for_Vec3fa_0)
                      ((auVar95 & _DAT_01ffd530 | ~auVar95 & auVar144) & auVar25);
        lVar41 = 0;
        do {
          pcVar55[lVar41 + 0x60] = local_1e60[lVar41 * 4];
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        lVar41 = 0;
        do {
          pcVar55[lVar41 + 100] = local_1d90[lVar41 * 4];
          lVar41 = lVar41 + 1;
        } while (lVar41 != 4);
        *(float *)(pcVar56 + 0x70) = fVar187;
        *(float *)(pcVar56 + 0x7c) = fVar125;
        local_1cc0 = local_1cc0 + 1;
        pcVar55 = pcVar55 + 0x90;
      } while (local_1cc0 != local_1cd8);
    }
    (local_1e88->ref).ptr = local_1aa8;
    *(undefined8 *)&(local_1e88->lbounds).bounds0.lower.field_0 = local_1e70._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds0.lower.field_0 + 8) = local_1e70._8_8_;
    *(undefined8 *)&(local_1e88->lbounds).bounds0.upper.field_0 = local_1dc0._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds0.upper.field_0 + 8) = local_1dc0._8_8_;
    *(undefined8 *)&(local_1e88->lbounds).bounds1.lower.field_0 = local_1d00._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds1.lower.field_0 + 8) = local_1d00._8_8_;
    *(undefined8 *)&(local_1e88->lbounds).bounds1.upper.field_0 = local_1dd0._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds1.upper.field_0 + 8) = local_1dd0._8_8_;
    local_1e88->dt = BStack_1898;
    return local_1e88;
  }
  lVar41 = 0xbc;
  do {
    *(undefined8 *)((long)&uStack_124c + lVar41) = 0xffffffff7f800000;
    *(undefined8 *)(&stack0xffffffffffffedbc + lVar41) = 0;
    lVar41 = lVar41 + 0xf0;
  } while (lVar41 != 0xfbc);
  local_2c0 = 1;
  local_b8 = 1;
  local_1240 = (undefined1  [8])uVar67;
  local_1230 = aVar123;
  _local_1220 = aVar160.m128;
  _local_1210 = aVar165.m128;
  _local_1200 = local_18f0;
  local_11f0.m128[0] = local_1ec0;
  local_11f0.m128[1] = fStack_1ebc;
  local_11f0.m128[2] = fStack_1eb8;
  local_11f0.m128[3] = fStack_1eb4;
  _local_11e0 = local_1ea0.m128;
  local_11d0[0] = SUB84(pTVar9,0);
  local_11d0[1] = (float)((ulong)pTVar9 >> 0x20);
  uStack_11c8._0_4_ = SUB84(pTVar10,0);
  uStack_11c8._4_4_ = (float)((ulong)pTVar10 >> 0x20);
  local_11c0 = local_1840;
  sStack_11b8 = sStack_1838;
  local_11b0 = local_1830;
  BStack_11a8 = BStack_1828;
  local_11a0[0] = BVar6;
  local_2b8 = BVar6;
  local_2b0[0].lower = 2.8026e-45;
  local_2b0[0].upper = 0.0;
  local_340[0] = &local_2b8;
  local_1e70._0_8_ = &this->heuristicTemporalSplit;
  local_1dc0._0_8_ = &local_1c30;
  local_1dd0._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)&local_1b40;
  local_1f60._8_8_ = 0x7f8000007f800000;
  local_1f60._0_8_ = 0x7f8000007f800000;
  local_1f30._8_8_ = 0xff800000ff800000;
  local_1f30._0_8_ = 0xff800000ff800000;
  bVar69 = false;
  do {
    if (local_2c0 == 0) {
      uVar67 = 0xffffffffffffffff;
    }
    else {
      uVar67 = 0xffffffffffffffff;
      pfVar46 = local_11d0;
      uVar54 = 0;
      uVar59 = 0;
      do {
        uVar61 = *(long *)(pfVar46 + 2) - *(long *)pfVar46;
        if ((((this->cfg).maxLeafSize < uVar61) || (1 < (uint)pfVar46[0x13])) || ((uVar57 & 1) != 0)
           ) {
          if (uVar54 < uVar61) {
            uVar67 = uVar59;
            uVar54 = uVar61;
          }
          uVar57 = 0.0;
        }
        uVar59 = uVar59 + 1;
        pfVar46 = pfVar46 + 0x3c;
      } while (local_2c0 != uVar59);
    }
    if (uVar67 != 0xffffffffffffffff) {
      lVar41 = uVar67 * 0xf0;
      local_1cb0._0_8_ = (ThreadLocal2 *)(local_1930 + 1);
      local_1c00 = (anon_class_1_0_00000001 *)0xffffffff7f800000;
      uStack_1bf8 = 0;
      local_1bc0._0_8_ = (ThreadLocal2 *)(local_1930 + 1);
      local_1b10 = 0xffffffff7f800000;
      uStack_1b08 = 0;
      iVar51 = *(int *)((long)local_1180 + lVar41 + -4);
      local_1ea0.m128[0] = (float)uVar57;
      if (iVar51 == 0) {
        sVar48 = *(size_t *)(local_11d0 + uVar67 * 0x3c);
        end = (&uStack_11c8)[uVar67 * 0x1e];
        uStack_1e58 = 0x7f8000007f800000;
        local_1e60 = (undefined1  [8])0x7f8000007f800000;
        local_1e50._0_8_ = 0xff800000ff800000;
        local_1e50._8_8_ = 0xff800000ff800000;
        local_1e40._0_8_ = 0x7f8000007f800000;
        local_1e40._8_8_ = 0x7f8000007f800000;
        local_1e30._0_8_ = 0xff800000ff800000;
        local_1e30._8_8_ = 0xff800000ff800000;
        local_1e20._0_8_ = 0x7f8000007f800000;
        local_1e20._8_8_ = 0x7f8000007f800000;
        local_1e10._0_8_ = 0xff800000ff800000;
        local_1e10._8_8_ = 0xff800000ff800000;
        local_1de0 = 0.0;
        local_1df0 = 0;
        sStack_1de8 = 0;
        local_1e00 = 0;
        sStack_1df8 = 0;
        fStack_1ddc = 1.0;
        fStack_1dd8 = 1.0;
        fStack_1dd4 = 0.0;
        uStack_1d88 = 0x7f8000007f800000;
        local_1d90 = (undefined1  [8])0x7f8000007f800000;
        local_1d80._0_8_ = 0xff800000ff800000;
        local_1d80._8_8_ = 0xff800000ff800000;
        local_1d70._0_8_ = 0x7f8000007f800000;
        local_1d70._8_8_ = 0x7f8000007f800000;
        local_1d60._0_8_ = 0xff800000ff800000;
        local_1d60._8_8_ = 0xff800000ff800000;
        local_1d50._0_8_ = 0x7f8000007f800000;
        local_1d50._8_8_ = 0x7f8000007f800000;
        local_1d40._0_8_ = 0xff800000ff800000;
        local_1d40._8_8_ = 0xff800000ff800000;
        local_1d10 = 0.0;
        local_1d20 = 0;
        sStack_1d18 = 0;
        local_1d30 = 0;
        sStack_1d28 = 0;
        fStack_1d0c = 1.0;
        fStack_1d08 = 1.0;
        fStack_1d04 = 0.0;
        local_19b0._4_4_ = *(undefined4 *)(&uStack_1188 + uVar67 * 0x1e);
        local_19b0._0_4_ = local_19b0._4_4_;
        local_19b0._12_4_ = local_19b0._4_4_;
        local_19b0._8_4_ = local_19b0._4_4_;
        lVar42 = (long)(1 << (local_1190[lVar41 + 4] & 0x1f)) * 0x10;
        local_1ad0.m128[0] = ((BBox1f *)(mm_lookupmask_ps + lVar42))->lower;
        local_1ad0.m128[1] = ((BBox1f *)(mm_lookupmask_ps + lVar42))->upper;
        local_1ad0._8_8_ = *(float **)(mm_lookupmask_ps + lVar42 + 8);
        local_1a40._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)(local_1190 + lVar41);
        stack0xffffffffffffe5c8 = (vint *)local_19b0;
        local_1a30._0_8_ = &local_1ad0;
        sStack_1c38 = parallel_partitioning<embree::PrimRefMB,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::EmptyTy,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimRefMB_const&)_1_,embree::sse2::HeuristicArrayBinningMB<embree::PrimRefMB,32ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_>
                                (*(PrimRefMB **)((long)local_11a0[uVar67 * 0x1e] + 0x20),sVar48,end,
                                 (EmptyTy *)local_1a50,
                                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1e60,
                                 (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1d90,
                                 (anon_class_24_3_c5d13451 *)local_1a40,
                                 (anon_class_1_0_00000001 *)&local_1cf0.field_1,
                                 (anon_class_1_0_00000001 *)&local_1a68,0x80,0xc00);
        local_1c10 = local_11a0[uVar67 * 0x1e];
        BVar6 = local_11a0[uVar67 * 0x1e + -1];
        local_1c70._8_8_ = local_1e30._8_8_;
        local_1c70._0_8_ = local_1e30._0_8_;
        local_1ca0._0_8_ = local_1e60;
        local_1ca0._8_8_ = uStack_1e58;
        local_1c90 = local_1e50._0_8_;
        uStack_1c88 = local_1e50._8_8_;
        local_1c80 = local_1e40._0_8_;
        uStack_1c78 = local_1e40._8_8_;
        local_1c60 = local_1e20._0_8_;
        uStack_1c58 = local_1e20._8_8_;
        local_1c50 = local_1e10._0_8_;
        uStack_1c48 = local_1e10._8_8_;
        *(size_t *)(local_1dc0._0_8_ + 0x10) = CONCAT44(fStack_1ddc,local_1de0);
        *(size_t *)(local_1dc0._0_8_ + 0x18) = CONCAT44(fStack_1dd4,fStack_1dd8);
        *(size_t *)local_1dc0._0_8_ = local_1df0;
        *(size_t *)(local_1dc0._0_8_ + 8) = sStack_1de8;
        fVar176 = BVar6.lower;
        fVar182 = fVar176;
        if (fVar176 <= BStack_1c18.lower) {
          fVar182 = BStack_1c18.lower;
        }
        fVar181 = BVar6.upper;
        if (fVar181 <= BStack_1c18.upper) {
          BStack_1c18.upper = fVar181;
        }
        BStack_1c18.lower = fVar182;
        local_1bb0._0_8_ = local_1d90;
        local_1bb0._8_8_ = uStack_1d88;
        local_1ba0 = local_1d80._0_8_;
        uStack_1b98 = local_1d80._8_8_;
        local_1b90 = local_1d70._0_8_;
        uStack_1b88 = local_1d70._8_8_;
        local_1b80 = local_1d60._0_8_;
        uStack_1b78 = local_1d60._8_8_;
        local_1b70._8_8_ = local_1d50._8_8_;
        local_1b70._0_8_ = local_1d50._0_8_;
        local_1b60._8_8_ = local_1d40._8_8_;
        local_1b60._0_8_ = local_1d40._0_8_;
        auVar169._4_4_ = fStack_1d0c;
        auVar169._0_4_ = local_1d10;
        auVar169._8_4_ = fStack_1d08;
        auVar169._12_4_ = fStack_1d04;
        *(undefined1 (*) [16])(local_1dd0._0_8_ + 0x10) = auVar169;
        *(size_t *)local_1dd0._0_8_ = local_1d20;
        *(size_t *)(local_1dd0._0_8_ + 8) = sStack_1d18;
        if (fVar176 <= BStack_1b28.lower) {
          BVar6 = (BBox1f)((ulong)BStack_1b28 & 0xffffffff);
        }
        if (fVar181 <= BStack_1b28.upper) {
          BStack_1b28.upper = fVar181;
        }
        BStack_1b28.lower = BVar6.lower;
        local_1c40 = sVar48;
        local_1b50 = sStack_1c38;
        sStack_1b48 = end;
        local_1b20 = local_1c10;
LAB_00d796ef:
        local_1ea8.lower = 0.0;
        local_1ea8.upper = 0.0;
        uVar57 = local_1ea0._0_4_;
      }
      else {
        paVar43 = &local_1230 + uVar67 * 0xf;
        if (iVar51 != 2) {
          if (iVar51 == 1) {
            SetMB::deterministic_order((SetMB *)&paVar43->field_1);
            splitFallback(this,(SetMB *)&paVar43->field_1,(SetMB *)&local_1ca0.field_1,
                          (SetMB *)&local_1bb0.field_1);
          }
          else if (iVar51 == 3) {
            SetMB::deterministic_order((SetMB *)&paVar43->field_1);
            splitByGeometry(this,(SetMB *)&paVar43->field_1,(SetMB *)&local_1ca0.field_1,
                            (SetMB *)&local_1bb0.field_1);
          }
          goto LAB_00d796ef;
        }
        local_1e80._0_4_ = *(undefined4 *)(&uStack_1188 + uVar67 * 0x1e);
        local_1e80._8_4_ = local_11a0[uVar67 * 0x1e + -1].lower;
        local_1e80._4_4_ = local_11a0[uVar67 * 0x1e + -1].upper;
        BVar6 = local_11a0[uVar67 * 0x1e];
        local_1e80._12_4_ = local_1e80._0_4_;
        BVar44 = (BBox1f)operator_new(0x28);
        puVar49 = *(undefined8 **)local_1e70._0_8_;
        lVar42 = (&uStack_11c8)[uVar67 * 0x1e];
        *(undefined8 **)BVar44 = puVar49;
        *(undefined1 *)((long)BVar44 + 8) = 0;
        *(undefined8 *)((long)BVar44 + 0x10) = 0;
        *(undefined8 *)((long)BVar44 + 0x18) = 0;
        *(undefined8 *)((long)BVar44 + 0x20) = 0;
        lVar42 = lVar42 - *(long *)(local_11d0 + uVar67 * 0x3c);
        uVar57 = local_1ea0._0_4_;
        if (lVar42 != 0) {
          uVar54 = lVar42 * 0x50;
          (**(code **)*puVar49)(puVar49,uVar54,0);
          if (uVar54 < 0x1c00000) {
            pvVar45 = alignedMalloc(uVar54,0x10);
          }
          else {
            pvVar45 = os_malloc(uVar54,(bool *)((long)BVar44 + 8));
          }
          *(void **)((long)BVar44 + 0x20) = pvVar45;
          *(long *)((long)BVar44 + 0x10) = lVar42;
          *(long *)((long)BVar44 + 0x18) = lVar42;
        }
        uVar127 = stack0xffffffffffffe5c8;
        local_1ad0.m128[0] = BVar6.lower;
        local_1ad0.m128[1] = BVar6.upper;
        local_1ad0._8_8_ = ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_1e80)->m128 + 2;
        local_1ac0 = local_1e70._0_8_;
        local_1ab8 = &local_1da8;
        local_1ab0 = paVar43;
        paVar43 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)(local_11d0 + uVar67 * 0x3c);
        paVar8 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)(&uStack_11c8)[uVar67 * 0x1e];
        uStack_1d88 = 0x7f8000007f800000;
        local_1d90 = (undefined1  [8])0x7f8000007f800000;
        local_1d80._0_8_ = 0xff800000ff800000;
        local_1d80._8_8_ = 0xff800000ff800000;
        local_1d70._0_8_ = 0x7f8000007f800000;
        local_1d70._8_8_ = 0x7f8000007f800000;
        local_1d60._0_8_ = 0xff800000ff800000;
        local_1d60._8_8_ = 0xff800000ff800000;
        local_1d50._0_8_ = 0x7f8000007f800000;
        local_1d50._8_8_ = 0x7f8000007f800000;
        local_1d40._0_8_ = 0xff800000ff800000;
        local_1d40._8_8_ = 0xff800000ff800000;
        local_1d10 = 0.0;
        local_1d20 = 0;
        sStack_1d18 = 0;
        local_1d30 = 0;
        sStack_1d28 = 0;
        fStack_1d0c = 1.0;
        fStack_1d08 = 1.0;
        fStack_1d04 = 0.0;
        local_1ea8 = BVar44;
        local_1da8 = BVar44;
        if ((ulong)((long)paVar8 - (long)paVar43) < 0xc00) {
          local_1a40._0_8_ = paVar43;
          unique0x1000b782 = paVar8;
          ::anon_func::anon_class_40_5_808acc65::operator()
                    ((PrimInfoMB *)local_1e60,(anon_class_40_5_808acc65 *)&local_1ad0.field_1,
                     (range<unsigned_long> *)local_1a40);
        }
        else {
          tStack_1a34 = proxy_support;
          local_1a20._0_8_ = (intrusive_list_node *)0x0;
          local_1a20._8_8_ = (intrusive_list_node *)0x0;
          local_1a00._0_8_ = CUSTOM_CTX;
          uStack_1a32 = SUB82(uVar127,6);
          cStack_1a33 = (context_traits)0x4;
          tbb::detail::r1::initialize((task_group_context *)local_1a40);
          local_19a0 = (anon_union_8_2_d71db6ad_for_task_group_context_11)0x80;
          local_1cf0._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_1cf0._8_8_ = &local_1ad0;
          local_19b0._0_8_ = paVar8;
          local_19b0._8_8_ = paVar43;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1e60,(d1 *)local_19b0,
                     (blocked_range<unsigned_long> *)local_1d90,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)&local_1cf0.field_1,
                     (anon_class_16_2_ed117de8_conflict20 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)local_1a40,in_stack_ffffffffffffe080);
          cVar39 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_1a40);
          if (cVar39 != '\0') {
            prVar50 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar50,"task cancelled");
            __cxa_throw(prVar50,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)local_1a40);
          uVar57 = local_1ea0._0_4_;
        }
        if (sStack_1df8 - local_1e00 !=
            (&uStack_11c8)[uVar67 * 0x1e] - *(long *)(local_11d0 + uVar67 * 0x3c)) {
          local_1d90 = (undefined1  [8])
                       (((anon_union_16_2_47237d3f_for_Vec3fa_0 *)local_1e80)->m128 + 2);
          sStack_1df8 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_1_>
                                  (*(PrimRefMB **)((long)local_1da8 + 0x20),0,
                                   (&uStack_11c8)[uVar67 * 0x1e] -
                                   *(long *)(local_11d0 + uVar67 * 0x3c),0x400,
                                   (anon_class_8_1_41ce32a5 *)local_1d90);
        }
        uVar127 = local_19b0._8_8_;
        *(size_t *)local_1dc0._0_8_ = local_1df0;
        *(size_t *)(local_1dc0._0_8_ + 8) = sStack_1de8;
        local_1ca0._0_8_ = local_1e60;
        local_1ca0._8_8_ = uStack_1e58;
        local_1c90 = local_1e50._0_8_;
        uStack_1c88 = local_1e50._8_8_;
        local_1c80 = local_1e40._0_8_;
        uStack_1c78 = local_1e40._8_8_;
        local_1c70._8_8_ = local_1e30._8_8_;
        local_1c70._0_8_ = local_1e30._0_8_;
        local_1c60 = local_1e20._0_8_;
        uStack_1c58 = local_1e20._8_8_;
        local_1c50 = local_1e10._0_8_;
        uStack_1c48 = local_1e10._8_8_;
        local_1c40 = local_1e00;
        sStack_1c38 = sStack_1df8;
        local_1c20.upper = fStack_1ddc;
        local_1c20.lower = local_1de0;
        BStack_1c18 = (BBox1f)(CONCAT44(~-(uint)(fStack_1dd4 < (float)local_1e80._12_4_) &
                                        local_1e80._12_4_,
                                        ~-(uint)(fStack_1dd8 < (float)local_1e80._8_4_) &
                                        (uint)fStack_1dd8) |
                              CONCAT44((uint)fStack_1dd4 &
                                       -(uint)(fStack_1dd4 < (float)local_1e80._12_4_),
                                       local_1e80._8_4_ &
                                       -(uint)(fStack_1dd8 < (float)local_1e80._8_4_)));
        local_1c10 = local_1da8;
        local_1a68.time_range1 = (BBox1f *)local_1e80;
        local_1a68.this =
             (HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::sse2::VirtualRecalculatePrimRef,_2UL>
              *)local_1e70._0_8_;
        paVar43 = *(anon_union_16_2_47237d3f_for_Vec3fa_0 **)(local_11d0 + uVar67 * 0x3c);
        paVar8 = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)(&uStack_11c8)[uVar67 * 0x1e];
        local_1a40._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)0x7f8000007f800000;
        stack0xffffffffffffe5c8 = (vint *)0x7f8000007f800000;
        local_1a30._0_8_ = (anon_union_16_2_47237d3f_for_Vec3fa_0 *)0xff800000ff800000;
        local_1a30._8_8_ = (context_list *)0xff800000ff800000;
        local_1a20._0_8_ = (intrusive_list_node *)0x7f8000007f800000;
        local_1a20._8_8_ = (intrusive_list_node *)0x7f8000007f800000;
        local_1a10._0_8_ = (__pointer_type)0xff800000ff800000;
        local_1a10._8_8_ = (void *)0xff800000ff800000;
        local_1a00._0_8_ = 0x7f8000007f800000;
        local_1a00._8_1_ = '\0';
        local_1a00._9_1_ = '\0';
        local_1a00._10_1_ = -0x80;
        local_1a00._11_1_ = '\x7f';
        local_1a00._12_1_ = '\0';
        local_1a00._13_1_ = '\0';
        local_1a00._14_1_ = -0x80;
        local_1a00._15_1_ = '\x7f';
        local_19f0 = 0xff800000ff800000;
        uStack_19e8 = 0xff800000ff800000;
        local_19c0 = 0;
        local_19d0.lower = 0.0;
        local_19d0.upper = 0.0;
        BStack_19c8.lower = 0.0;
        BStack_19c8.upper = 0.0;
        local_19e0 = 0;
        sStack_19d8 = 0;
        local_19bc = &DAT_3f8000003f800000;
        local_19b4 = 0;
        local_1a68.prims = (mvector<embree::PrimRefMB> *)BVar6;
        if ((ulong)((long)paVar8 - (long)paVar43) < 0xc00) {
          local_19b0._0_8_ = paVar43;
          local_19b0._8_8_ = paVar8;
          ::anon_func::anon_class_24_3_35f68c7c::operator()
                    ((PrimInfoMB *)local_1d90,&local_1a68,(range<unsigned_long> *)local_19b0);
        }
        else {
          local_19b0[0xc] = proxy_support;
          local_1990 = (intrusive_list_node *)0x0;
          piStack_1988 = (intrusive_list_node *)0x0;
          local_1970 = CUSTOM_CTX;
          local_19b0._14_2_ = SUB82(uVar127,6);
          local_19b0[0xd] = (context_traits)0x4;
          tbb::detail::r1::initialize((task_group_context *)local_19b0);
          local_1ce0 = 0x80;
          local_1a50._0_8_ = PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2;
          local_1a50._8_8_ = &local_1a68;
          local_1cf0._0_8_ = paVar8;
          local_1cf0._8_8_ = paVar43;
          tbb::detail::d1::
          parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>(unsigned_long,unsigned_long,unsigned_long,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::range<unsigned_long>const&)_2_const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(const&)(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&))::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)_1_,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const(embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&,embree::PrimInfoMBT<embree::LBBox<embree::Vec3fa>>const&)>
                    ((PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1d90,
                     (d1 *)&local_1cf0.field_1,(blocked_range<unsigned_long> *)local_1a40,
                     (PrimInfoMBT<embree::LBBox<embree::Vec3fa>_> *)local_1a50,
                     (anon_class_16_2_ed117de8_conflict21 *)
                     PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>::merge2,
                     (_func_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr_PrimInfoMBT<embree::LBBox<embree::Vec3fa>_>_ptr
                      *)local_19b0,in_stack_ffffffffffffe080);
          cVar39 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_19b0);
          if (cVar39 != '\0') {
            prVar50 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar50,"task cancelled");
            __cxa_throw(prVar50,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          tbb::detail::r1::destroy((task_group_context *)local_19b0);
          uVar57 = local_1ea0._0_4_;
        }
        lVar42 = sStack_1d28 - local_1d30;
        local_1d30 = *(unsigned_long *)(local_11d0 + uVar67 * 0x3c);
        sStack_1d28 = lVar42 + local_1d30;
        if (lVar42 != (&uStack_11c8)[uVar67 * 0x1e] - local_1d30) {
          local_1a40._0_8_ = local_1e80;
          sStack_1d28 = parallel_filter<embree::PrimRefMB,unsigned_long,embree::sse2::HeuristicMBlurTemporalSplit<embree::PrimRefMB,embree::sse2::GridRecalculatePrimRef,2ul>::split(embree::sse2::BinSplit<32ul>const&,embree::SetMB_const&,embree::SetMB&,embree::SetMB&)::_lambda(embree::PrimRefMB_const&)_2_>
                                  (*(PrimRefMB **)((long)BVar6 + 0x20),local_1d30,
                                   (&uStack_11c8)[uVar67 * 0x1e],0x400,
                                   (anon_class_8_1_41ce32a6 *)local_1a40);
        }
        local_1bb0._0_8_ = local_1d90;
        local_1bb0._8_8_ = uStack_1d88;
        local_1ba0 = local_1d80._0_8_;
        uStack_1b98 = local_1d80._8_8_;
        local_1b90 = local_1d70._0_8_;
        uStack_1b88 = local_1d70._8_8_;
        local_1b80 = local_1d60._0_8_;
        uStack_1b78 = local_1d60._8_8_;
        local_1b70._8_8_ = local_1d50._8_8_;
        local_1b70._0_8_ = local_1d50._0_8_;
        local_1b60._8_8_ = local_1d40._8_8_;
        local_1b60._0_8_ = local_1d40._0_8_;
        auVar81._8_8_ = sStack_1d18;
        auVar81._0_8_ = local_1d20;
        *(undefined1 (*) [16])local_1dd0._0_8_ = auVar81;
        local_1b50 = local_1d30;
        sStack_1b48 = sStack_1d28;
        local_1b30.upper = fStack_1d0c;
        local_1b30.lower = local_1d10;
        BStack_1b28 = (BBox1f)(CONCAT44(~-(uint)(fStack_1d04 < (float)local_1e80._4_4_) &
                                        local_1e80._4_4_,
                                        ~-(uint)(fStack_1d08 < (float)local_1e80._0_4_) &
                                        (uint)fStack_1d08) |
                              CONCAT44((uint)fStack_1d04 &
                                       -(uint)(fStack_1d04 < (float)local_1e80._4_4_),
                                       local_1e80._0_4_ &
                                       -(uint)(fStack_1d08 < (float)local_1e80._0_4_)));
        local_1b20 = BVar6;
      }
      bVar70 = local_1ea8 != (BBox1f)0x0;
      findFallback((Split *)local_1e60,this,(SetMB *)&local_1ca0.field_1);
      local_1bf0 = local_1e50._0_8_;
      local_1be0 = local_1e40._0_8_;
      uStack_1bd8 = local_1e40._8_8_;
      local_1bd0 = local_1e30._0_8_;
      uStack_1bc8 = local_1e30._8_8_;
      findFallback((Split *)local_1e60,this,(SetMB *)&local_1bb0.field_1);
      lVar42 = local_b8;
      local_1b00 = local_1e50._0_8_;
      local_1af0 = local_1e40._0_8_;
      uStack_1ae8 = local_1e40._8_8_;
      local_1ae0 = local_1e30._0_8_;
      uStack_1ad8 = local_1e30._8_8_;
      local_1ea8.lower = 0.0;
      local_1ea8.upper = 0.0;
      pBVar7 = local_340[uVar67];
      if (local_1c10 == *pBVar7) {
        pBVar7[1] = (BBox1f)((long)pBVar7[1] + 1);
      }
      else {
        local_b8 = local_b8 + 1;
        local_2b0[lVar42 * 2 + -1] = local_1c10;
        local_2b0[lVar42 * 2].lower = 1.4013e-45;
        local_2b0[lVar42 * 2].upper = 0.0;
        local_340[uVar67] = local_2b0 + lVar42 * 2 + -1;
      }
      lVar42 = local_b8;
      if (local_1b20 == *pBVar7) {
        local_340[local_2c0] = pBVar7;
        pBVar7[1] = (BBox1f)((long)pBVar7[1] + 1);
      }
      else {
        local_b8 = local_b8 + 1;
        local_2b0[lVar42 * 2 + -1] = local_1b20;
        local_2b0[lVar42 * 2].lower = 1.4013e-45;
        local_2b0[lVar42 * 2].upper = 0.0;
        local_340[local_2c0] = local_2b0 + lVar42 * 2 + -1;
      }
      pBVar12 = pBVar7 + 1;
      *pBVar12 = (BBox1f)((long)*pBVar12 + -1);
      if ((*pBVar12 == (BBox1f)0x0) && (BVar6 = *pBVar7, BVar6 != (BBox1f)0x0)) {
        lVar42 = *(long *)((long)BVar6 + 0x18);
        pvVar45 = *(void **)((long)BVar6 + 0x20);
        if (pvVar45 != (void *)0x0) {
          if ((ulong)(lVar42 * 0x50) < 0x1c00000) {
            alignedFree(pvVar45);
          }
          else {
            os_free(pvVar45,lVar42 * 0x50,*(bool *)((long)BVar6 + 8));
          }
        }
        if (lVar42 != 0) {
          (**(code **)**(undefined8 **)BVar6)(*(undefined8 **)BVar6,lVar42 * -0x50,1);
        }
        *(undefined8 *)((long)BVar6 + 0x10) = 0;
        *(undefined8 *)((long)BVar6 + 0x18) = 0;
        *(undefined8 *)((long)BVar6 + 0x20) = 0;
        operator_delete((void *)BVar6);
      }
      *(undefined8 *)(local_1240 + uVar67 * 0xf0) = local_1cb0._0_8_;
      *(undefined8 *)(&local_1230 + uVar67 * 0xf) = local_1ca0._0_8_;
      *(undefined8 *)((long)&local_1230 + lVar41 + 8) = local_1ca0._8_8_;
      *(size_t *)(local_1220 + lVar41) = local_1c90;
      *(undefined8 *)(local_1220 + lVar41 + 8) = uStack_1c88;
      *(ulong *)(local_1210 + lVar41) = local_1c80;
      *(ulong *)(local_1210 + lVar41 + 8) = uStack_1c78;
      *(undefined8 *)(local_1200 + lVar41) = local_1c70._0_8_;
      *(undefined8 *)(local_1200 + lVar41 + 8) = local_1c70._8_8_;
      *(undefined8 *)(local_11f0.m128 + uVar67 * 0x3c) = local_1c60;
      *(undefined8 *)(local_11e0 + uVar67 * 0xf0 + -8) = uStack_1c58;
      *(undefined8 *)(local_11e0 + lVar41) = local_1c50;
      *(undefined8 *)(local_11e0 + lVar41 + 8) = uStack_1c48;
      *(size_t *)(local_11d0 + uVar67 * 0x3c) = local_1c40;
      (&uStack_11c8)[uVar67 * 0x1e] = sStack_1c38;
      (&local_11c0)[uVar67 * 0x1e] = local_1c30;
      (&sStack_11b8)[uVar67 * 0x1e] = sStack_1c28;
      (&local_11b0)[uVar67 * 0x1e] = local_1c20;
      local_11a0[uVar67 * 0x1e + -1] = BStack_1c18;
      local_11a0[uVar67 * 0x1e] = local_1c10;
      *(anon_class_1_0_00000001 **)
       &(((anon_union_16_2_47237d3f_for_Vec3fa_0 *)(local_1190 + lVar41))->field_1).x = local_1c00;
      (&uStack_1188)[uVar67 * 0x1e] = uStack_1bf8;
      uVar54 = local_2c0;
      local_1180[uVar67 * 0x1e] = local_1bf0;
      local_1170[uVar67 * 0x1e] = local_1be0;
      local_1170[uVar67 * 0x1e + 1] = uStack_1bd8;
      local_1170[uVar67 * 0x1e + 2] = local_1bd0;
      local_1170[uVar67 * 0x1e + 3] = uStack_1bc8;
      lVar41 = local_2c0 * 0xf0;
      *(undefined8 *)(local_1240 + local_2c0 * 0xf0) = local_1bc0._0_8_;
      *(undefined8 *)(&local_1230 + uVar54 * 0xf) = local_1bb0._0_8_;
      *(undefined8 *)((long)&local_1230 + lVar41 + 8) = local_1bb0._8_8_;
      *(undefined8 *)(local_1220 + lVar41) = local_1ba0;
      *(undefined8 *)(local_1220 + lVar41 + 8) = uStack_1b98;
      *(undefined8 *)(local_1210 + lVar41) = local_1b90;
      *(undefined8 *)(local_1210 + lVar41 + 8) = uStack_1b88;
      *(undefined8 *)(local_1200 + lVar41) = local_1b80;
      *(undefined8 *)(local_1200 + lVar41 + 8) = uStack_1b78;
      *(undefined8 *)(local_11f0.m128 + uVar54 * 0x3c) = local_1b70._0_8_;
      *(undefined8 *)(local_11e0 + uVar54 * 0xf0 + -8) = local_1b70._8_8_;
      *(undefined8 *)(local_11e0 + lVar41) = local_1b60._0_8_;
      *(undefined8 *)(local_11e0 + lVar41 + 8) = local_1b60._8_8_;
      *(unsigned_long *)(local_11d0 + uVar54 * 0x3c) = local_1b50;
      (&uStack_11c8)[uVar54 * 0x1e] = sStack_1b48;
      (&local_11c0)[uVar54 * 0x1e] = local_1b40;
      (&sStack_11b8)[uVar54 * 0x1e] = sStack_1b38;
      (&local_11b0)[uVar54 * 0x1e] = local_1b30;
      local_11a0[uVar54 * 0x1e + -1] = BStack_1b28;
      local_11a0[uVar54 * 0x1e] = local_1b20;
      *(undefined8 *)(local_1190 + lVar41) = local_1b10;
      (&uStack_1188)[uVar54 * 0x1e] = uStack_1b08;
      local_1180[uVar54 * 0x1e] = local_1b00;
      local_1170[uVar54 * 0x1e] = local_1af0;
      local_1170[uVar54 * 0x1e + 1] = uStack_1ae8;
      local_1170[uVar54 * 0x1e + 2] = local_1ae0;
      local_1170[uVar54 * 0x1e + 3] = uStack_1ad8;
      local_2c0 = local_2c0 + 1;
      if (local_1ea8 != (BBox1f)0x0) {
        std::
        default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
        ::operator()((default_delete<embree::vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>_>
                      *)&local_1ea8,
                     (vector_t<embree::PrimRefMB,_embree::aligned_monitored_allocator<embree::PrimRefMB,_16UL>_>
                      *)local_1ea8);
      }
      bVar69 = (bool)(bVar69 | bVar70);
    }
  } while ((uVar67 != 0xffffffffffffffff) && (local_2c0 < (this->cfg).branchingFactor));
  if (local_2c0 != 0) {
    pfVar46 = &fStack_11a4;
    uVar67 = local_2c0;
    do {
      bVar69 = (bool)(bVar69 | (*pfVar46 < *(float *)(local_1d00._0_8_ + 0x9c) ||
                               *(float *)(local_1d00._0_8_ + 0x98) < pfVar46[-1]));
      pfVar46 = pfVar46 + 0x3c;
      uVar67 = uVar67 - 1;
    } while (uVar67 != 0);
  }
  if (!bVar69) {
    local_1d90 = (undefined1  [8])0xe0;
    pTVar9 = (alloc.talloc0)->parent;
    if (alloc.alloc != (pTVar9->alloc)._M_b._M_p) {
      local_1bc0[8] = 1;
      local_1bc0._0_8_ = pTVar9;
      MutexSys::lock(&pTVar9->mutex);
      if ((pTVar9->alloc)._M_b._M_p != (__pointer_type)0x0) {
        LOCK();
        paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesUsed;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar9->alloc1).bytesUsed + (pTVar9->alloc0).bytesUsed;
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesFree;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (((pTVar9->alloc0).end + (pTVar9->alloc1).end) -
             ((pTVar9->alloc0).cur + (pTVar9->alloc1).cur));
        UNLOCK();
        LOCK();
        paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesWasted;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i +
             (pTVar9->alloc1).bytesWasted + (pTVar9->alloc0).bytesWasted;
        UNLOCK();
      }
      (pTVar9->alloc0).bytesUsed = 0;
      (pTVar9->alloc0).bytesWasted = 0;
      (pTVar9->alloc0).end = 0;
      (pTVar9->alloc0).allocBlockSize = 0;
      (pTVar9->alloc0).ptr = (char *)0x0;
      (pTVar9->alloc0).cur = 0;
      if (alloc.alloc == (FastAllocator *)0x0) {
        (pTVar9->alloc1).bytesUsed = 0;
        (pTVar9->alloc1).bytesWasted = 0;
        (pTVar9->alloc1).end = 0;
        (pTVar9->alloc1).allocBlockSize = 0;
        (pTVar9->alloc1).ptr = (char *)0x0;
        (pTVar9->alloc1).cur = 0;
      }
      else {
        (pTVar9->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
        (pTVar9->alloc1).ptr = (char *)0x0;
        (pTVar9->alloc1).cur = 0;
        (pTVar9->alloc1).end = 0;
        (pTVar9->alloc1).allocBlockSize = 0;
        (pTVar9->alloc1).bytesUsed = 0;
        (pTVar9->alloc1).bytesWasted = 0;
        (pTVar9->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      }
      LOCK();
      (pTVar9->alloc)._M_b._M_p = alloc.alloc;
      UNLOCK();
      local_1e60 = (undefined1  [8])pTVar9;
      local_1cb0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
      local_1cb0._8_1_ = 1;
      MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      iVar11._M_current =
           ((alloc.alloc)->thread_local_allocators).
           super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar11._M_current ==
          ((alloc.alloc)->thread_local_allocators).
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
        ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                  ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                    *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)local_1e60);
      }
      else {
        *iVar11._M_current = (ThreadLocal2 *)local_1e60;
        pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar2 = *pppTVar2 + 1;
      }
      if (local_1cb0._8_1_ == '\x01') {
        MutexSys::unlock((MutexSys *)local_1cb0._0_8_);
      }
      if (local_1bc0[8] == '\x01') {
        MutexSys::unlock((MutexSys *)local_1bc0._0_8_);
      }
    }
    (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + (long)local_1d90;
    sVar48 = (alloc.talloc0)->cur;
    uVar67 = (ulong)(-(int)sVar48 & 0xf);
    uVar54 = sVar48 + (long)local_1d90 + uVar67;
    (alloc.talloc0)->cur = uVar54;
    if ((alloc.talloc0)->end < uVar54) {
      (alloc.talloc0)->cur = sVar48;
      if ((ThreadLocal2 *)(alloc.talloc0)->allocBlockSize < (ThreadLocal2 *)((long)local_1d90 << 2))
      {
        pcVar55 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1d90);
      }
      else {
        local_1cb0._0_8_ = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
        pcVar55 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1cb0);
        (alloc.talloc0)->ptr = pcVar55;
        sVar48 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar48;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = local_1cb0._0_8_;
        (alloc.talloc0)->cur = (size_t)local_1d90;
        if ((ulong)local_1cb0._0_8_ < (ulong)local_1d90) {
          (alloc.talloc0)->cur = 0;
          local_1cb0._0_8_ = (alloc.talloc0)->allocBlockSize;
          pcVar55 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1cb0);
          (alloc.talloc0)->ptr = pcVar55;
          sVar48 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
          (alloc.talloc0)->bytesWasted = sVar48;
          (alloc.talloc0)->cur = 0;
          (alloc.talloc0)->end = local_1cb0._0_8_;
          (alloc.talloc0)->cur = (size_t)local_1d90;
          if ((ulong)local_1cb0._0_8_ < (ulong)local_1d90) {
            (alloc.talloc0)->cur = 0;
            pcVar55 = (char *)0x0;
            goto LAB_00d7a90c;
          }
        }
        (alloc.talloc0)->bytesWasted = sVar48;
      }
    }
    else {
      (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar67;
      pcVar55 = (alloc.talloc0)->ptr + (uVar54 - (long)local_1d90);
    }
LAB_00d7a90c:
    pcVar55[0x60] = '\0';
    pcVar55[0x61] = '\0';
    pcVar55[0x62] = -0x80;
    pcVar55[99] = '\x7f';
    pcVar55[100] = '\0';
    pcVar55[0x65] = '\0';
    pcVar55[0x66] = -0x80;
    pcVar55[0x67] = '\x7f';
    pcVar55[0x68] = '\0';
    pcVar55[0x69] = '\0';
    pcVar55[0x6a] = -0x80;
    pcVar55[0x6b] = '\x7f';
    pcVar55[0x6c] = '\0';
    pcVar55[0x6d] = '\0';
    pcVar55[0x6e] = -0x80;
    pcVar55[0x6f] = '\x7f';
    pcVar55[0x40] = '\0';
    pcVar55[0x41] = '\0';
    pcVar55[0x42] = -0x80;
    pcVar55[0x43] = '\x7f';
    pcVar55[0x44] = '\0';
    pcVar55[0x45] = '\0';
    pcVar55[0x46] = -0x80;
    pcVar55[0x47] = '\x7f';
    pcVar55[0x48] = '\0';
    pcVar55[0x49] = '\0';
    pcVar55[0x4a] = -0x80;
    pcVar55[0x4b] = '\x7f';
    pcVar55[0x4c] = '\0';
    pcVar55[0x4d] = '\0';
    pcVar55[0x4e] = -0x80;
    pcVar55[0x4f] = '\x7f';
    pcVar55[0x20] = '\0';
    pcVar55[0x21] = '\0';
    pcVar55[0x22] = -0x80;
    pcVar55[0x23] = '\x7f';
    pcVar55[0x24] = '\0';
    pcVar55[0x25] = '\0';
    pcVar55[0x26] = -0x80;
    pcVar55[0x27] = '\x7f';
    pcVar55[0x28] = '\0';
    pcVar55[0x29] = '\0';
    pcVar55[0x2a] = -0x80;
    pcVar55[0x2b] = '\x7f';
    pcVar55[0x2c] = '\0';
    pcVar55[0x2d] = '\0';
    pcVar55[0x2e] = -0x80;
    pcVar55[0x2f] = '\x7f';
    pcVar55[0x70] = '\0';
    pcVar55[0x71] = '\0';
    pcVar55[0x72] = -0x80;
    pcVar55[0x73] = -1;
    pcVar55[0x74] = '\0';
    pcVar55[0x75] = '\0';
    pcVar55[0x76] = -0x80;
    pcVar55[0x77] = -1;
    pcVar55[0x78] = '\0';
    pcVar55[0x79] = '\0';
    pcVar55[0x7a] = -0x80;
    pcVar55[0x7b] = -1;
    pcVar55[0x7c] = '\0';
    pcVar55[0x7d] = '\0';
    pcVar55[0x7e] = -0x80;
    pcVar55[0x7f] = -1;
    pcVar55[0x50] = '\0';
    pcVar55[0x51] = '\0';
    pcVar55[0x52] = -0x80;
    pcVar55[0x53] = -1;
    pcVar55[0x54] = '\0';
    pcVar55[0x55] = '\0';
    pcVar55[0x56] = -0x80;
    pcVar55[0x57] = -1;
    pcVar55[0x58] = '\0';
    pcVar55[0x59] = '\0';
    pcVar55[0x5a] = -0x80;
    pcVar55[0x5b] = -1;
    pcVar55[0x5c] = '\0';
    pcVar55[0x5d] = '\0';
    pcVar55[0x5e] = -0x80;
    pcVar55[0x5f] = -1;
    pcVar55[0x30] = '\0';
    pcVar55[0x31] = '\0';
    pcVar55[0x32] = -0x80;
    pcVar55[0x33] = -1;
    pcVar55[0x34] = '\0';
    pcVar55[0x35] = '\0';
    pcVar55[0x36] = -0x80;
    pcVar55[0x37] = -1;
    pcVar55[0x38] = '\0';
    pcVar55[0x39] = '\0';
    pcVar55[0x3a] = -0x80;
    pcVar55[0x3b] = -1;
    pcVar55[0x3c] = '\0';
    pcVar55[0x3d] = '\0';
    pcVar55[0x3e] = -0x80;
    pcVar55[0x3f] = -1;
    pcVar55[0x80] = '\0';
    pcVar55[0x81] = '\0';
    pcVar55[0x82] = '\0';
    pcVar55[0x83] = '\0';
    pcVar55[0x84] = '\0';
    pcVar55[0x85] = '\0';
    pcVar55[0x86] = '\0';
    pcVar55[0x87] = '\0';
    pcVar55[0x88] = '\0';
    pcVar55[0x89] = '\0';
    pcVar55[0x8a] = '\0';
    pcVar55[0x8b] = '\0';
    pcVar55[0x8c] = '\0';
    pcVar55[0x8d] = '\0';
    pcVar55[0x8e] = '\0';
    pcVar55[0x8f] = '\0';
    pcVar55[0x90] = '\0';
    pcVar55[0x91] = '\0';
    pcVar55[0x92] = '\0';
    pcVar55[0x93] = '\0';
    pcVar55[0x94] = '\0';
    pcVar55[0x95] = '\0';
    pcVar55[0x96] = '\0';
    pcVar55[0x97] = '\0';
    pcVar55[0x98] = '\0';
    pcVar55[0x99] = '\0';
    pcVar55[0x9a] = '\0';
    pcVar55[0x9b] = '\0';
    pcVar55[0x9c] = '\0';
    pcVar55[0x9d] = '\0';
    pcVar55[0x9e] = '\0';
    pcVar55[0x9f] = '\0';
    pcVar55[0xa0] = '\0';
    pcVar55[0xa1] = '\0';
    pcVar55[0xa2] = '\0';
    pcVar55[0xa3] = '\0';
    pcVar55[0xa4] = '\0';
    pcVar55[0xa5] = '\0';
    pcVar55[0xa6] = '\0';
    pcVar55[0xa7] = '\0';
    pcVar55[0xa8] = '\0';
    pcVar55[0xa9] = '\0';
    pcVar55[0xaa] = '\0';
    pcVar55[0xab] = '\0';
    pcVar55[0xac] = '\0';
    pcVar55[0xad] = '\0';
    pcVar55[0xae] = '\0';
    pcVar55[0xaf] = '\0';
    pcVar55[0xb0] = '\0';
    pcVar55[0xb1] = '\0';
    pcVar55[0xb2] = '\0';
    pcVar55[0xb3] = '\0';
    pcVar55[0xb4] = '\0';
    pcVar55[0xb5] = '\0';
    pcVar55[0xb6] = '\0';
    pcVar55[0xb7] = '\0';
    pcVar55[0xb8] = '\0';
    pcVar55[0xb9] = '\0';
    pcVar55[0xba] = '\0';
    pcVar55[0xbb] = '\0';
    pcVar55[0xbc] = '\0';
    pcVar55[0xbd] = '\0';
    pcVar55[0xbe] = '\0';
    pcVar55[0xbf] = '\0';
    pcVar55[0xc0] = '\0';
    pcVar55[0xc1] = '\0';
    pcVar55[0xc2] = '\0';
    pcVar55[0xc3] = '\0';
    pcVar55[0xc4] = '\0';
    pcVar55[0xc5] = '\0';
    pcVar55[0xc6] = '\0';
    pcVar55[199] = '\0';
    pcVar55[200] = '\0';
    pcVar55[0xc9] = '\0';
    pcVar55[0xca] = '\0';
    pcVar55[0xcb] = '\0';
    pcVar55[0xcc] = '\0';
    pcVar55[0xcd] = '\0';
    pcVar55[0xce] = '\0';
    pcVar55[0xcf] = '\0';
    pcVar55[0xd0] = '\0';
    pcVar55[0xd1] = '\0';
    pcVar55[0xd2] = '\0';
    pcVar55[0xd3] = '\0';
    pcVar55[0xd4] = '\0';
    pcVar55[0xd5] = '\0';
    pcVar55[0xd6] = '\0';
    pcVar55[0xd7] = '\0';
    pcVar55[0xd8] = '\0';
    pcVar55[0xd9] = '\0';
    pcVar55[0xda] = '\0';
    pcVar55[0xdb] = '\0';
    pcVar55[0xdc] = '\0';
    pcVar55[0xdd] = '\0';
    pcVar55[0xde] = '\0';
    pcVar55[0xdf] = '\0';
    lVar41 = 0;
    do {
      pcVar56 = pcVar55 + lVar41 * 8;
      pcVar56[0] = '\b';
      pcVar56[1] = '\0';
      pcVar56[2] = '\0';
      pcVar56[3] = '\0';
      pcVar56[4] = '\0';
      pcVar56[5] = '\0';
      pcVar56[6] = '\0';
      pcVar56[7] = '\0';
      pcVar56[8] = '\b';
      pcVar56[9] = '\0';
      pcVar56[10] = '\0';
      pcVar56[0xb] = '\0';
      pcVar56[0xc] = '\0';
      pcVar56[0xd] = '\0';
      pcVar56[0xe] = '\0';
      pcVar56[0xf] = '\0';
      lVar41 = lVar41 + 2;
    } while (lVar41 != 4);
    uVar67 = 1;
    goto LAB_00d7a97b;
  }
  local_1d90 = (undefined1  [8])0x100;
  pTVar9 = (alloc.talloc0)->parent;
  if (alloc.alloc != (pTVar9->alloc)._M_b._M_p) {
    local_1bc0[8] = 1;
    local_1bc0._0_8_ = pTVar9;
    MutexSys::lock(&pTVar9->mutex);
    if ((pTVar9->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar9->alloc1).bytesUsed + (pTVar9->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((pTVar9->alloc0).end + (pTVar9->alloc1).end) -
           ((pTVar9->alloc0).cur + (pTVar9->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((pTVar9->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (pTVar9->alloc1).bytesWasted + (pTVar9->alloc0).bytesWasted;
      UNLOCK();
    }
    (pTVar9->alloc0).bytesUsed = 0;
    (pTVar9->alloc0).bytesWasted = 0;
    (pTVar9->alloc0).end = 0;
    (pTVar9->alloc0).allocBlockSize = 0;
    (pTVar9->alloc0).ptr = (char *)0x0;
    (pTVar9->alloc0).cur = 0;
    if (alloc.alloc == (FastAllocator *)0x0) {
      (pTVar9->alloc1).bytesUsed = 0;
      (pTVar9->alloc1).bytesWasted = 0;
      (pTVar9->alloc1).end = 0;
      (pTVar9->alloc1).allocBlockSize = 0;
      (pTVar9->alloc1).ptr = (char *)0x0;
      (pTVar9->alloc1).cur = 0;
    }
    else {
      (pTVar9->alloc0).allocBlockSize = (alloc.alloc)->defaultBlockSize;
      (pTVar9->alloc1).ptr = (char *)0x0;
      (pTVar9->alloc1).cur = 0;
      (pTVar9->alloc1).end = 0;
      (pTVar9->alloc1).allocBlockSize = 0;
      (pTVar9->alloc1).bytesUsed = 0;
      (pTVar9->alloc1).bytesWasted = 0;
      (pTVar9->alloc1).allocBlockSize = (alloc.alloc)->defaultBlockSize;
    }
    LOCK();
    (pTVar9->alloc)._M_b._M_p = alloc.alloc;
    UNLOCK();
    local_1e60 = (undefined1  [8])pTVar9;
    local_1cb0._0_8_ = &FastAllocator::s_thread_local_allocators_lock;
    local_1cb0._8_1_ = 1;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    iVar11._M_current =
         ((alloc.alloc)->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar11._M_current ==
        ((alloc.alloc)->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(alloc.alloc)->thread_local_allocators,iVar11,(ThreadLocal2 **)local_1e60);
    }
    else {
      *iVar11._M_current = (ThreadLocal2 *)local_1e60;
      pppTVar2 = &((alloc.alloc)->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar2 = *pppTVar2 + 1;
    }
    if (local_1cb0._8_1_ == '\x01') {
      MutexSys::unlock((MutexSys *)local_1cb0._0_8_);
    }
    if (local_1bc0[8] == '\x01') {
      MutexSys::unlock((MutexSys *)local_1bc0._0_8_);
    }
  }
  (alloc.talloc0)->bytesUsed = (alloc.talloc0)->bytesUsed + (long)local_1d90;
  sVar48 = (alloc.talloc0)->cur;
  uVar67 = (ulong)(-(int)sVar48 & 0xf);
  uVar54 = sVar48 + (long)local_1d90 + uVar67;
  (alloc.talloc0)->cur = uVar54;
  if ((alloc.talloc0)->end < uVar54) {
    (alloc.talloc0)->cur = sVar48;
    if ((ThreadLocal2 *)(alloc.talloc0)->allocBlockSize < (ThreadLocal2 *)((long)local_1d90 << 2)) {
      pcVar55 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)local_1d90);
    }
    else {
      local_1cb0._0_8_ = (ThreadLocal2 *)(alloc.talloc0)->allocBlockSize;
      pcVar55 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1cb0);
      (alloc.talloc0)->ptr = pcVar55;
      sVar48 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
      (alloc.talloc0)->bytesWasted = sVar48;
      (alloc.talloc0)->cur = 0;
      (alloc.talloc0)->end = local_1cb0._0_8_;
      (alloc.talloc0)->cur = (size_t)local_1d90;
      if ((ulong)local_1cb0._0_8_ < (ulong)local_1d90) {
        (alloc.talloc0)->cur = 0;
        local_1cb0._0_8_ = (alloc.talloc0)->allocBlockSize;
        pcVar55 = (char *)FastAllocator::malloc(alloc.alloc,(size_t)&local_1cb0);
        (alloc.talloc0)->ptr = pcVar55;
        sVar48 = ((alloc.talloc0)->end - (alloc.talloc0)->cur) + (alloc.talloc0)->bytesWasted;
        (alloc.talloc0)->bytesWasted = sVar48;
        (alloc.talloc0)->cur = 0;
        (alloc.talloc0)->end = local_1cb0._0_8_;
        (alloc.talloc0)->cur = (size_t)local_1d90;
        if ((ulong)local_1cb0._0_8_ < (ulong)local_1d90) {
          (alloc.talloc0)->cur = 0;
          pcVar55 = (char *)0x0;
          goto LAB_00d7a811;
        }
      }
      (alloc.talloc0)->bytesWasted = sVar48;
    }
  }
  else {
    (alloc.talloc0)->bytesWasted = (alloc.talloc0)->bytesWasted + uVar67;
    pcVar55 = (alloc.talloc0)->ptr + (uVar54 - (long)local_1d90);
  }
LAB_00d7a811:
  pcVar55[0xe0] = '\0';
  pcVar55[0xe1] = '\0';
  pcVar55[0xe2] = -0x80;
  pcVar55[0xe3] = '\x7f';
  pcVar55[0xe4] = '\0';
  pcVar55[0xe5] = '\0';
  pcVar55[0xe6] = -0x80;
  pcVar55[0xe7] = '\x7f';
  pcVar55[0xe8] = '\0';
  pcVar55[0xe9] = '\0';
  pcVar55[0xea] = -0x80;
  pcVar55[0xeb] = '\x7f';
  pcVar55[0xec] = '\0';
  pcVar55[0xed] = '\0';
  pcVar55[0xee] = -0x80;
  pcVar55[0xef] = '\x7f';
  pcVar55[0xf0] = '\0';
  pcVar55[0xf1] = '\0';
  pcVar55[0xf2] = -0x80;
  pcVar55[0xf3] = -1;
  pcVar55[0xf4] = '\0';
  pcVar55[0xf5] = '\0';
  pcVar55[0xf6] = -0x80;
  pcVar55[0xf7] = -1;
  pcVar55[0xf8] = '\0';
  pcVar55[0xf9] = '\0';
  pcVar55[0xfa] = -0x80;
  pcVar55[0xfb] = -1;
  pcVar55[0xfc] = '\0';
  pcVar55[0xfd] = '\0';
  pcVar55[0xfe] = -0x80;
  pcVar55[0xff] = -1;
  pcVar55[0x60] = '\0';
  pcVar55[0x61] = '\0';
  pcVar55[0x62] = -0x80;
  pcVar55[99] = '\x7f';
  pcVar55[100] = '\0';
  pcVar55[0x65] = '\0';
  pcVar55[0x66] = -0x80;
  pcVar55[0x67] = '\x7f';
  pcVar55[0x68] = '\0';
  pcVar55[0x69] = '\0';
  pcVar55[0x6a] = -0x80;
  pcVar55[0x6b] = '\x7f';
  pcVar55[0x6c] = '\0';
  pcVar55[0x6d] = '\0';
  pcVar55[0x6e] = -0x80;
  pcVar55[0x6f] = '\x7f';
  pcVar55[0x40] = '\0';
  pcVar55[0x41] = '\0';
  pcVar55[0x42] = -0x80;
  pcVar55[0x43] = '\x7f';
  pcVar55[0x44] = '\0';
  pcVar55[0x45] = '\0';
  pcVar55[0x46] = -0x80;
  pcVar55[0x47] = '\x7f';
  pcVar55[0x48] = '\0';
  pcVar55[0x49] = '\0';
  pcVar55[0x4a] = -0x80;
  pcVar55[0x4b] = '\x7f';
  pcVar55[0x4c] = '\0';
  pcVar55[0x4d] = '\0';
  pcVar55[0x4e] = -0x80;
  pcVar55[0x4f] = '\x7f';
  pcVar55[0x20] = '\0';
  pcVar55[0x21] = '\0';
  pcVar55[0x22] = -0x80;
  pcVar55[0x23] = '\x7f';
  pcVar55[0x24] = '\0';
  pcVar55[0x25] = '\0';
  pcVar55[0x26] = -0x80;
  pcVar55[0x27] = '\x7f';
  pcVar55[0x28] = '\0';
  pcVar55[0x29] = '\0';
  pcVar55[0x2a] = -0x80;
  pcVar55[0x2b] = '\x7f';
  pcVar55[0x2c] = '\0';
  pcVar55[0x2d] = '\0';
  pcVar55[0x2e] = -0x80;
  pcVar55[0x2f] = '\x7f';
  pcVar55[0x70] = '\0';
  pcVar55[0x71] = '\0';
  pcVar55[0x72] = -0x80;
  pcVar55[0x73] = -1;
  pcVar55[0x74] = '\0';
  pcVar55[0x75] = '\0';
  pcVar55[0x76] = -0x80;
  pcVar55[0x77] = -1;
  pcVar55[0x78] = '\0';
  pcVar55[0x79] = '\0';
  pcVar55[0x7a] = -0x80;
  pcVar55[0x7b] = -1;
  pcVar55[0x7c] = '\0';
  pcVar55[0x7d] = '\0';
  pcVar55[0x7e] = -0x80;
  pcVar55[0x7f] = -1;
  pcVar55[0x50] = '\0';
  pcVar55[0x51] = '\0';
  pcVar55[0x52] = -0x80;
  pcVar55[0x53] = -1;
  pcVar55[0x54] = '\0';
  pcVar55[0x55] = '\0';
  pcVar55[0x56] = -0x80;
  pcVar55[0x57] = -1;
  pcVar55[0x58] = '\0';
  pcVar55[0x59] = '\0';
  pcVar55[0x5a] = -0x80;
  pcVar55[0x5b] = -1;
  pcVar55[0x5c] = '\0';
  pcVar55[0x5d] = '\0';
  pcVar55[0x5e] = -0x80;
  pcVar55[0x5f] = -1;
  pcVar55[0x30] = '\0';
  pcVar55[0x31] = '\0';
  pcVar55[0x32] = -0x80;
  pcVar55[0x33] = -1;
  pcVar55[0x34] = '\0';
  pcVar55[0x35] = '\0';
  pcVar55[0x36] = -0x80;
  pcVar55[0x37] = -1;
  pcVar55[0x38] = '\0';
  pcVar55[0x39] = '\0';
  pcVar55[0x3a] = -0x80;
  pcVar55[0x3b] = -1;
  pcVar55[0x3c] = '\0';
  pcVar55[0x3d] = '\0';
  pcVar55[0x3e] = -0x80;
  pcVar55[0x3f] = -1;
  pcVar55[0x80] = '\0';
  pcVar55[0x81] = '\0';
  pcVar55[0x82] = '\0';
  pcVar55[0x83] = '\0';
  pcVar55[0x84] = '\0';
  pcVar55[0x85] = '\0';
  pcVar55[0x86] = '\0';
  pcVar55[0x87] = '\0';
  pcVar55[0x88] = '\0';
  pcVar55[0x89] = '\0';
  pcVar55[0x8a] = '\0';
  pcVar55[0x8b] = '\0';
  pcVar55[0x8c] = '\0';
  pcVar55[0x8d] = '\0';
  pcVar55[0x8e] = '\0';
  pcVar55[0x8f] = '\0';
  pcVar55[0x90] = '\0';
  pcVar55[0x91] = '\0';
  pcVar55[0x92] = '\0';
  pcVar55[0x93] = '\0';
  pcVar55[0x94] = '\0';
  pcVar55[0x95] = '\0';
  pcVar55[0x96] = '\0';
  pcVar55[0x97] = '\0';
  pcVar55[0x98] = '\0';
  pcVar55[0x99] = '\0';
  pcVar55[0x9a] = '\0';
  pcVar55[0x9b] = '\0';
  pcVar55[0x9c] = '\0';
  pcVar55[0x9d] = '\0';
  pcVar55[0x9e] = '\0';
  pcVar55[0x9f] = '\0';
  pcVar55[0xa0] = '\0';
  pcVar55[0xa1] = '\0';
  pcVar55[0xa2] = '\0';
  pcVar55[0xa3] = '\0';
  pcVar55[0xa4] = '\0';
  pcVar55[0xa5] = '\0';
  pcVar55[0xa6] = '\0';
  pcVar55[0xa7] = '\0';
  pcVar55[0xa8] = '\0';
  pcVar55[0xa9] = '\0';
  pcVar55[0xaa] = '\0';
  pcVar55[0xab] = '\0';
  pcVar55[0xac] = '\0';
  pcVar55[0xad] = '\0';
  pcVar55[0xae] = '\0';
  pcVar55[0xaf] = '\0';
  pcVar55[0xb0] = '\0';
  pcVar55[0xb1] = '\0';
  pcVar55[0xb2] = '\0';
  pcVar55[0xb3] = '\0';
  pcVar55[0xb4] = '\0';
  pcVar55[0xb5] = '\0';
  pcVar55[0xb6] = '\0';
  pcVar55[0xb7] = '\0';
  pcVar55[0xb8] = '\0';
  pcVar55[0xb9] = '\0';
  pcVar55[0xba] = '\0';
  pcVar55[0xbb] = '\0';
  pcVar55[0xbc] = '\0';
  pcVar55[0xbd] = '\0';
  pcVar55[0xbe] = '\0';
  pcVar55[0xbf] = '\0';
  pcVar55[0xc0] = '\0';
  pcVar55[0xc1] = '\0';
  pcVar55[0xc2] = '\0';
  pcVar55[0xc3] = '\0';
  pcVar55[0xc4] = '\0';
  pcVar55[0xc5] = '\0';
  pcVar55[0xc6] = '\0';
  pcVar55[199] = '\0';
  pcVar55[200] = '\0';
  pcVar55[0xc9] = '\0';
  pcVar55[0xca] = '\0';
  pcVar55[0xcb] = '\0';
  pcVar55[0xcc] = '\0';
  pcVar55[0xcd] = '\0';
  pcVar55[0xce] = '\0';
  pcVar55[0xcf] = '\0';
  pcVar55[0xd0] = '\0';
  pcVar55[0xd1] = '\0';
  pcVar55[0xd2] = '\0';
  pcVar55[0xd3] = '\0';
  pcVar55[0xd4] = '\0';
  pcVar55[0xd5] = '\0';
  pcVar55[0xd6] = '\0';
  pcVar55[0xd7] = '\0';
  pcVar55[0xd8] = '\0';
  pcVar55[0xd9] = '\0';
  pcVar55[0xda] = '\0';
  pcVar55[0xdb] = '\0';
  pcVar55[0xdc] = '\0';
  pcVar55[0xdd] = '\0';
  pcVar55[0xde] = '\0';
  pcVar55[0xdf] = '\0';
  lVar41 = 0;
  do {
    pcVar56 = pcVar55 + lVar41 * 8;
    pcVar56[0] = '\b';
    pcVar56[1] = '\0';
    pcVar56[2] = '\0';
    pcVar56[3] = '\0';
    pcVar56[4] = '\0';
    pcVar56[5] = '\0';
    pcVar56[6] = '\0';
    pcVar56[7] = '\0';
    pcVar56[8] = '\b';
    pcVar56[9] = '\0';
    pcVar56[10] = '\0';
    pcVar56[0xb] = '\0';
    pcVar56[0xc] = '\0';
    pcVar56[0xd] = '\0';
    pcVar56[0xe] = '\0';
    pcVar56[0xf] = '\0';
    lVar41 = lVar41 + 2;
  } while (lVar41 != 4);
  uVar67 = 6;
LAB_00d7a97b:
  local_1f50._8_8_ = 0xff800000ff800000;
  local_1f50._0_8_ = 0xff800000ff800000;
  local_1ef0._8_8_ = 0x7f8000007f800000;
  local_1ef0._0_8_ = 0x7f8000007f800000;
  in_00 = (BuildRecord *)local_1240;
  if (local_2c0 != 0) {
    pfVar46 = local_17f0;
    uVar54 = 0;
    local_1ef0._8_8_ = 0x7f8000007f800000;
    local_1ef0._0_8_ = 0x7f8000007f800000;
    local_1f60._8_8_ = 0x7f8000007f800000;
    local_1f60._0_8_ = 0x7f8000007f800000;
    local_1f50._8_8_ = 0xff800000ff800000;
    local_1f50._0_8_ = 0xff800000ff800000;
    local_1f30._8_8_ = 0xff800000ff800000;
    local_1f30._0_8_ = 0xff800000ff800000;
    do {
      createLargeLeaf((NodeRecordMB4D *)&local_1cb0.field_1,this,in_00,alloc);
      *(undefined8 *)(pfVar46 + -0x14) = local_1cb0._0_8_;
      auVar172._8_8_ = local_1ca0._8_8_;
      auVar172._0_8_ = local_1ca0._0_8_;
      *(undefined1 (*) [16])(pfVar46 + -0x10) = auVar172;
      *(size_t *)(pfVar46 + -0xc) = local_1c90;
      *(undefined8 *)(pfVar46 + -10) = uStack_1c88;
      *(ulong *)(pfVar46 + -8) = local_1c80;
      *(ulong *)(pfVar46 + -6) = uStack_1c78;
      *(undefined8 *)(pfVar46 + -4) = local_1c70._0_8_;
      *(undefined8 *)(pfVar46 + -2) = local_1c70._8_8_;
      *(undefined8 *)pfVar46 = local_1c60;
      local_1f50 = maxps(local_1f50,*(undefined1 (*) [16])(pfVar46 + -0xc));
      local_1f60 = minps(local_1f60,*(undefined1 (*) [16])(pfVar46 + -8));
      local_1ef0 = minps(local_1ef0,auVar172);
      local_1f30 = maxps(local_1f30,*(undefined1 (*) [16])(pfVar46 + -4));
      uVar54 = uVar54 + 1;
      pfVar46 = pfVar46 + 0x18;
      in_00 = (BuildRecord *)
              &in_00[1].prims.super_PrimInfoMB.super_CentGeom<embree::LBBox<embree::Vec3fa>_>.
               geomBounds.bounds1.upper;
    } while (uVar54 < local_2c0);
  }
  auVar138 = _DAT_01ff1820;
  auVar81 = _DAT_01ff1810;
  uVar67 = uVar67 | (ulong)pcVar55;
  if (((uint)uVar67 & 0xf) == 1) {
    if (local_2c0 != 0) {
      uVar59 = (ulong)pcVar55 & 0xfffffffffffffff0;
      pfVar46 = local_17f0 + 1;
      uVar54 = 0;
      do {
        *(undefined8 *)(uVar59 + uVar54 * 8) = *(undefined8 *)(pfVar46 + -0x15);
        fVar182 = pfVar46[-1];
        fVar181 = 1.0 / (*pfVar46 - fVar182);
        fVar188 = -fVar182 * fVar181;
        fVar176 = 1.0 - fVar188;
        auVar178._0_4_ = pfVar46[-0x11] * fVar176 + pfVar46[-9] * fVar188;
        auVar178._4_4_ = pfVar46[-0x10] * fVar176 + pfVar46[-8] * fVar188;
        auVar178._8_4_ = pfVar46[-0xf] * fVar176 + pfVar46[-7] * fVar188;
        auVar178._12_4_ = pfVar46[-0xe] * fVar176 + pfVar46[-6] * fVar188;
        auVar177._0_4_ = fVar176 * pfVar46[-0xd] + fVar188 * pfVar46[-5];
        auVar177._4_4_ = fVar176 * pfVar46[-0xc] + fVar188 * pfVar46[-4];
        auVar177._8_4_ = fVar176 * pfVar46[-0xb] + fVar188 * pfVar46[-3];
        auVar177._12_4_ = fVar176 * pfVar46[-10] + fVar188 * pfVar46[-2];
        fVar181 = (1.0 - fVar182) * fVar181;
        fVar182 = 1.0 - fVar181;
        auVar184._0_4_ = pfVar46[-0x11] * fVar182 + pfVar46[-9] * fVar181;
        auVar184._4_4_ = pfVar46[-0x10] * fVar182 + pfVar46[-8] * fVar181;
        auVar184._8_4_ = pfVar46[-0xf] * fVar182 + pfVar46[-7] * fVar181;
        auVar184._12_4_ = pfVar46[-0xe] * fVar182 + pfVar46[-6] * fVar181;
        auVar183._0_4_ = fVar182 * pfVar46[-0xd] + fVar181 * pfVar46[-5];
        auVar183._4_4_ = fVar182 * pfVar46[-0xc] + fVar181 * pfVar46[-4];
        auVar183._8_4_ = fVar182 * pfVar46[-0xb] + fVar181 * pfVar46[-3];
        auVar183._12_4_ = fVar182 * pfVar46[-10] + fVar181 * pfVar46[-2];
        auVar172 = minps(auVar178,auVar138);
        auVar178 = maxps(auVar177,auVar81);
        auVar169 = minps(auVar184,auVar138);
        auVar184 = maxps(auVar183,auVar81);
        fVar182 = auVar172._0_4_ - ABS(auVar172._0_4_) * 4.7683716e-07;
        fVar176 = auVar172._4_4_ - ABS(auVar172._4_4_) * 4.7683716e-07;
        fVar181 = auVar172._8_4_ - ABS(auVar172._8_4_) * 4.7683716e-07;
        fVar188 = ABS(auVar178._0_4_) * 4.7683716e-07 + auVar178._0_4_;
        fVar186 = ABS(auVar178._4_4_) * 4.7683716e-07 + auVar178._4_4_;
        fVar187 = ABS(auVar178._8_4_) * 4.7683716e-07 + auVar178._8_4_;
        *(float *)(uVar59 + 0x20 + uVar54 * 4) = fVar182;
        *(float *)(uVar59 + 0x40 + uVar54 * 4) = fVar176;
        *(float *)(uVar59 + 0x60 + uVar54 * 4) = fVar181;
        *(float *)(uVar59 + 0x30 + uVar54 * 4) = fVar188;
        *(float *)(uVar59 + 0x50 + uVar54 * 4) = fVar186;
        *(float *)(uVar59 + 0x70 + uVar54 * 4) = fVar187;
        *(float *)(uVar59 + 0x80 + uVar54 * 4) =
             (auVar169._0_4_ - ABS(auVar169._0_4_) * 4.7683716e-07) - fVar182;
        *(float *)(uVar59 + 0xa0 + uVar54 * 4) =
             (auVar169._4_4_ - ABS(auVar169._4_4_) * 4.7683716e-07) - fVar176;
        *(float *)(uVar59 + 0xc0 + uVar54 * 4) =
             (auVar169._8_4_ - ABS(auVar169._8_4_) * 4.7683716e-07) - fVar181;
        *(float *)(uVar59 + 0x90 + uVar54 * 4) =
             (ABS(auVar184._0_4_) * 4.7683716e-07 + auVar184._0_4_) - fVar188;
        *(float *)(uVar59 + 0xb0 + uVar54 * 4) =
             (ABS(auVar184._4_4_) * 4.7683716e-07 + auVar184._4_4_) - fVar186;
        *(float *)(uVar59 + 0xd0 + uVar54 * 4) =
             (ABS(auVar184._8_4_) * 4.7683716e-07 + auVar184._8_4_) - fVar187;
        uVar54 = uVar54 + 1;
        pfVar46 = pfVar46 + 0x18;
      } while (local_2c0 != uVar54);
    }
  }
  else {
    BuilderT<embree::NodeRefPtr<4>,embree::sse2::GridRecalculatePrimRef,embree::FastAllocator::CachedAllocator,embree::BVHN<4>::CreateAlloc,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Create,embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,4>::Set,embree::sse2::CreateMSMBlurLeafGrid<4>,embree::Scene::BuildProgressMonitorInterface>
    ::createLargeLeaf();
  }
  pTVar10 = pTStack_18b8;
  pTVar9 = local_18c0;
  if (bVar69) {
    local_19b0._8_8_ = &this->recalculatePrimRef;
    local_19b0._0_8_ = &local_1920;
    local_1bc0._0_8_ = (ThreadLocal2 *)0x7f8000007f800000;
    local_1bc0._8_8_ = 0x7f8000007f800000;
    local_1bb0._0_8_ = 0xff800000ff800000;
    local_1bb0._8_8_ = 0xff800000ff800000;
    local_1ba0 = 0x7f8000007f800000;
    uStack_1b98 = 0x7f8000007f800000;
    local_1b90 = 0xff800000ff800000;
    uStack_1b88 = 0xff800000ff800000;
    if ((ulong)((long)pTStack_18b8 - (long)local_18c0) < 0xc00) {
      local_1cb0._0_8_ = local_18c0;
      local_1cb0._8_8_ = pTStack_18b8;
      ::anon_func::anon_class_16_2_aeee9775::operator()
                ((LBBox3fa *)local_1e60,(anon_class_16_2_aeee9775 *)local_19b0,
                 (range<unsigned_long> *)&local_1cb0.field_1);
    }
    else {
      local_1cb0._12_2_ = 0x401;
      local_1c90 = 0;
      uStack_1c88 = 0;
      local_1c70._0_8_ = 8;
      tbb::detail::r1::initialize((task_group_context *)&local_1cb0.field_1);
      uStack_1d88 = pTVar9;
      local_1d90 = (undefined1  [8])pTVar10;
      local_1d80._0_8_ = 0x400;
      local_1a40._0_8_ = &local_1ad0;
      unique0x00005300 = local_19b0;
      tbb::detail::d1::
      parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::LBBox<embree::Vec3fa>,embree::parallel_reduce<unsigned_long,embree::LBBox<embree::Vec3fa>,embree::SetMB::linearBounds<embree::sse2::GridRecalculatePrimRef>(embree::sse2::GridRecalculatePrimRef_const&)const::_lambda(embree::range<unsigned_long>const&)_1_,embree::SetMB::linearBounds<embree::sse2::GridRecalculatePrimRef>(embree::sse2::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::LBBox<embree::Vec3fa>const&,embree::SetMB::linearBounds<embree::sse2::GridRecalculatePrimRef>(embree::sse2::GridRecalculatePrimRef_const&)const::_lambda(embree::range<unsigned_long>const&)_1_const&,embree::SetMB::linearBounds<embree::sse2::GridRecalculatePrimRef>(embree::sse2::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_const&)::_lambda(tbb::detail::d1::blocked_range<unsigned_long>const&,embree::LBBox<embree::Vec3fa>const&)_1_,embree::SetMB::linearBounds<embree::sse2::GridRecalculatePrimRef>(embree::sse2::GridRecalculatePrimRef_const&)const::_lambda(embree::LBBox<embree::Vec3fa>const&,embree::LBBox<embree::Vec3fa>const&)_1_>
                ((LBBox<embree::Vec3fa> *)local_1e60,(d1 *)local_1d90,
                 (blocked_range<unsigned_long> *)local_1bc0,(LBBox<embree::Vec3fa> *)local_1a40,
                 (anon_class_16_2_ed117de8_conflict22 *)local_1a40._0_8_,
                 (anon_class_1_0_00000001 *)&local_1cb0.field_1,in_stack_ffffffffffffe080);
      cVar39 = tbb::detail::r1::is_group_execution_cancelled
                         ((task_group_context *)&local_1cb0.field_1);
      if (cVar39 != '\0') {
        prVar50 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar50,"task cancelled");
        __cxa_throw(prVar50,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      tbb::detail::r1::destroy((task_group_context *)&local_1cb0.field_1);
    }
    (local_1e88->ref).ptr = uVar67;
    *(undefined1 (*) [8])&(local_1e88->lbounds).bounds0.lower.field_0 = local_1e60;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds0.lower.field_0 + 8) = uStack_1e58;
    *(undefined8 *)&(local_1e88->lbounds).bounds0.upper.field_0 = local_1e50._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds0.upper.field_0 + 8) = local_1e50._8_8_;
    *(undefined8 *)&(local_1e88->lbounds).bounds1.lower.field_0 = local_1e40._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds1.lower.field_0 + 8) = local_1e40._8_8_;
    local_1f30._0_8_ = local_1e30._0_8_;
    local_1f30._8_8_ = local_1e30._8_8_;
  }
  else {
    (local_1e88->ref).ptr = uVar67;
    *(undefined8 *)&(local_1e88->lbounds).bounds0.lower.field_0 = local_1ef0._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds0.lower.field_0 + 8) = local_1ef0._8_8_;
    *(undefined8 *)&(local_1e88->lbounds).bounds0.upper.field_0 = local_1f50._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds0.upper.field_0 + 8) = local_1f50._8_8_;
    *(undefined8 *)&(local_1e88->lbounds).bounds1.lower.field_0 = local_1f60._0_8_;
    *(undefined8 *)((long)&(local_1e88->lbounds).bounds1.lower.field_0 + 8) = local_1f60._8_8_;
  }
  *(undefined8 *)&(local_1e88->lbounds).bounds1.upper.field_0 = local_1f30._0_8_;
  *(undefined8 *)((long)&(local_1e88->lbounds).bounds1.upper.field_0 + 8) = local_1f30._8_8_;
  local_1e88->dt = BStack_1898;
  if (local_2c0 == 0) {
    return local_1e88;
  }
  uVar67 = 0;
  do {
    pBVar12 = local_340[uVar67];
    pBVar7 = pBVar12 + 1;
    *pBVar7 = (BBox1f)((long)*pBVar7 + -1);
    if ((*pBVar7 == (BBox1f)0x0) && (BVar6 = *pBVar12, BVar6 != (BBox1f)0x0)) {
      lVar41 = *(undefined8 *)((long)BVar6 + 0x18);
      pvVar45 = *(void **)((long)BVar6 + 0x20);
      if (pvVar45 != (void *)0x0) {
        if ((ulong)(lVar41 * 0x50) < 0x1c00000) {
          alignedFree(pvVar45);
        }
        else {
          os_free(pvVar45,lVar41 * 0x50,*(bool *)((long)BVar6 + 8));
        }
      }
      if (lVar41 != 0) {
        (**(code **)**(undefined8 **)BVar6)(*(undefined8 **)BVar6,lVar41 * -0x50,1);
      }
      *(undefined8 *)((long)BVar6 + 0x10) = 0;
      *(undefined8 *)((long)BVar6 + 0x18) = 0;
      *(undefined8 *)((long)BVar6 + 0x20) = 0;
      operator_delete((void *)BVar6);
    }
    uVar67 = uVar67 + 1;
  } while (uVar67 < local_2c0);
  return local_1e88;
}

Assistant:

const NodeRecordMB4D createLargeLeaf(const BuildRecord& in, Allocator alloc)
          {
            /* this should never occur but is a fatal error */
            if (in.depth > cfg.maxDepth)
              throw_RTCError(RTC_ERROR_UNKNOWN,"depth limit reached");

            /* replace already found split by fallback split */
            const BuildRecordSplit current(BuildRecord(in.prims,in.depth),findFallback(in.prims));

            /* special case when directly creating leaf without any splits that could shrink time_range */
            bool force_split = false;
            if (current.depth == 1 && current.size() > 0)
            {
              BBox1f c = empty;
              BBox1f p = current.prims.time_range;
              for (size_t i=current.prims.begin(); i<current.prims.end(); i++) {
                mvector<PrimRefMB>& prims = *current.prims.prims;
                c.extend(prims[i].time_range);
              }
              
              force_split = c.lower > p.lower || c.upper < p.upper;
            }
	    
            /* create leaf for few primitives */
            if (current.size() <= cfg.maxLeafSize && current.split.data < Split::SPLIT_ENFORCE && !force_split)
              return createLeaf(current,alloc);
	  
            /* fill all children by always splitting the largest one */
            bool hasTimeSplits = false;
            NodeRecordMB4D values[MAX_BRANCHING_FACTOR];
            LocalChildListSplit children(current);

            do {
              /* find best child with largest bounding box area */
              size_t bestChild = -1;
              size_t bestSize = 0;
              for (size_t i=0; i<children.size(); i++)
              {
                /* ignore leaves as they cannot get split */
                if (children[i].size() <= cfg.maxLeafSize && children[i].split.data < Split::SPLIT_ENFORCE && !force_split)
                  continue;

                force_split = false;
                
                /* remember child with largest size */
                if (children[i].size() > bestSize) {
                  bestSize = children[i].size();
                  bestChild = i;
                }
              }
              if (bestChild == -1) break;

              /* perform best found split */
              BuildRecordSplit& brecord = children[bestChild];
              BuildRecordSplit lrecord(current.depth+1);
              BuildRecordSplit rrecord(current.depth+1);
              std::unique_ptr<mvector<PrimRefMB>> new_vector = split(brecord.split,brecord.prims,lrecord.prims,rrecord.prims);
              hasTimeSplits |= new_vector != nullptr;

              /* find new splits */
              lrecord.split = findFallback(lrecord.prims);
              rrecord.split = findFallback(rrecord.prims);
              children.split(bestChild,lrecord,rrecord,std::move(new_vector));

            } while (children.size() < cfg.branchingFactor);

            /* detect time_ranges that have shrunken */
            for (size_t i=0; i<children.size(); i++) {
              const BBox1f c = children[i].prims.time_range;
              const BBox1f p = in.prims.time_range;
              hasTimeSplits |= c.lower > p.lower || c.upper < p.upper;
            }

            /* create node */
            auto node = createNode(children.children.data(),children.numChildren,alloc,hasTimeSplits);

            /* recurse into each child and perform reduction */
            LBBox3fa gbounds = empty;
            for (size_t i=0; i<children.size(); i++) {
              values[i] = createLargeLeaf(children[i],alloc);
              gbounds.extend(values[i].lbounds);
            }

            setNode(current,children.children.data(),node,values,children.numChildren);

            /* calculate geometry bounds of this node */
            if (hasTimeSplits)
              return NodeRecordMB4D(node,current.prims.linearBounds(recalculatePrimRef),current.prims.time_range);
            else
              return NodeRecordMB4D(node,gbounds,current.prims.time_range);
          }